

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiMBIntersectorK<4,16>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::BSplineCurveT,16,8>,embree::avx512::Occluded1KEpilogMU<8,16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  uint uVar7;
  int iVar8;
  Geometry *pGVar9;
  __int_type_conflict _Var10;
  RTCFilterFunctionN p_Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined8 uVar23;
  long lVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  byte bVar60;
  ulong uVar61;
  long lVar62;
  long lVar63;
  ulong uVar64;
  ulong uVar65;
  ulong uVar66;
  uint uVar67;
  Geometry *geometry;
  long lVar68;
  ulong uVar69;
  byte bVar70;
  float fVar71;
  float fVar72;
  float fVar121;
  float fVar123;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  float fVar122;
  float fVar124;
  float fVar125;
  float fVar126;
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  float fVar127;
  float fVar128;
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [64];
  undefined1 auVar120 [64];
  float fVar129;
  undefined4 uVar130;
  float fVar140;
  vint4 bi_2;
  undefined1 auVar131 [16];
  float fVar141;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [64];
  undefined8 uVar142;
  vint4 bi_1;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  vint4 bi;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar153;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  vint4 ai_2;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  vint4 ai_1;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  float fVar171;
  float fVar172;
  float fVar175;
  vint4 ai;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  undefined1 auVar194 [64];
  undefined1 auVar195 [64];
  undefined1 auVar196 [64];
  undefined1 auVar197 [16];
  undefined1 auVar198 [64];
  undefined1 auVar199 [64];
  undefined1 auVar200 [64];
  undefined1 auVar201 [64];
  undefined1 auVar202 [64];
  undefined1 auVar203 [64];
  RTCFilterFunctionNArguments args;
  float old_t;
  vint<16> mask;
  float old_t_1;
  RTCFilterFunctionNArguments local_910;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_890 [16];
  undefined1 local_880 [16];
  undefined1 local_870 [16];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  LinearSpace3fa *local_7d0;
  Primitive *local_7c8;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_710 [8];
  float fStack_708;
  float fStack_704;
  uint local_700;
  uint uStack_6fc;
  uint uStack_6f8;
  uint uStack_6f4;
  uint uStack_6f0;
  uint uStack_6ec;
  uint uStack_6e8;
  uint uStack_6e4;
  float local_6e0;
  float fStack_6dc;
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [64];
  undefined1 local_650 [16];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined4 local_5e0;
  int local_5dc;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  float local_580 [4];
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [64];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 auStack_420 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined4 uStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  PVar6 = prim[1];
  uVar61 = (ulong)(byte)PVar6;
  lVar24 = uVar61 * 0x25;
  fVar129 = *(float *)(prim + lVar24 + 0x12);
  auVar77 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar77 = vinsertps_avx(auVar77,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar76 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar76 = vinsertps_avx(auVar76,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar77 = vsubps_avx(auVar77,*(undefined1 (*) [16])(prim + lVar24 + 6));
  auVar154._0_4_ = fVar129 * auVar77._0_4_;
  auVar154._4_4_ = fVar129 * auVar77._4_4_;
  auVar154._8_4_ = fVar129 * auVar77._8_4_;
  auVar154._12_4_ = fVar129 * auVar77._12_4_;
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 4 + 6)));
  auVar131._0_4_ = fVar129 * auVar76._0_4_;
  auVar131._4_4_ = fVar129 * auVar76._4_4_;
  auVar131._8_4_ = fVar129 * auVar76._8_4_;
  auVar131._12_4_ = fVar129 * auVar76._12_4_;
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar76 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 5 + 6)));
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 6 + 6)));
  auVar197 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 0xf + 6)));
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar197 = vcvtdq2ps_avx(auVar197);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar61 + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 0x1a + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 0x1b + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 0x1c + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar166._4_4_ = auVar131._0_4_;
  auVar166._0_4_ = auVar131._0_4_;
  auVar166._8_4_ = auVar131._0_4_;
  auVar166._12_4_ = auVar131._0_4_;
  auVar79 = vshufps_avx(auVar131,auVar131,0x55);
  auVar80 = vshufps_avx(auVar131,auVar131,0xaa);
  fVar129 = auVar80._0_4_;
  auVar148._0_4_ = fVar129 * auVar78._0_4_;
  fVar153 = auVar80._4_4_;
  auVar148._4_4_ = fVar153 * auVar78._4_4_;
  fVar140 = auVar80._8_4_;
  auVar148._8_4_ = fVar140 * auVar78._8_4_;
  fVar141 = auVar80._12_4_;
  auVar148._12_4_ = fVar141 * auVar78._12_4_;
  auVar143._0_4_ = auVar19._0_4_ * fVar129;
  auVar143._4_4_ = auVar19._4_4_ * fVar153;
  auVar143._8_4_ = auVar19._8_4_ * fVar140;
  auVar143._12_4_ = auVar19._12_4_ * fVar141;
  auVar132._0_4_ = auVar22._0_4_ * fVar129;
  auVar132._4_4_ = auVar22._4_4_ * fVar153;
  auVar132._8_4_ = auVar22._8_4_ * fVar140;
  auVar132._12_4_ = auVar22._12_4_ * fVar141;
  auVar80 = vfmadd231ps_fma(auVar148,auVar79,auVar76);
  auVar26 = vfmadd231ps_fma(auVar143,auVar79,auVar18);
  auVar79 = vfmadd231ps_fma(auVar132,auVar21,auVar79);
  auVar81 = vfmadd231ps_fma(auVar80,auVar166,auVar77);
  auVar26 = vfmadd231ps_fma(auVar26,auVar166,auVar197);
  auVar27 = vfmadd231ps_fma(auVar79,auVar20,auVar166);
  auVar187._4_4_ = auVar154._0_4_;
  auVar187._0_4_ = auVar154._0_4_;
  auVar187._8_4_ = auVar154._0_4_;
  auVar187._12_4_ = auVar154._0_4_;
  auVar79 = vshufps_avx(auVar154,auVar154,0x55);
  auVar80 = vshufps_avx(auVar154,auVar154,0xaa);
  fVar129 = auVar80._0_4_;
  auVar167._0_4_ = fVar129 * auVar78._0_4_;
  fVar153 = auVar80._4_4_;
  auVar167._4_4_ = fVar153 * auVar78._4_4_;
  fVar140 = auVar80._8_4_;
  auVar167._8_4_ = fVar140 * auVar78._8_4_;
  fVar141 = auVar80._12_4_;
  auVar167._12_4_ = fVar141 * auVar78._12_4_;
  auVar158._0_4_ = auVar19._0_4_ * fVar129;
  auVar158._4_4_ = auVar19._4_4_ * fVar153;
  auVar158._8_4_ = auVar19._8_4_ * fVar140;
  auVar158._12_4_ = auVar19._12_4_ * fVar141;
  auVar155._0_4_ = auVar22._0_4_ * fVar129;
  auVar155._4_4_ = auVar22._4_4_ * fVar153;
  auVar155._8_4_ = auVar22._8_4_ * fVar140;
  auVar155._12_4_ = auVar22._12_4_ * fVar141;
  auVar76 = vfmadd231ps_fma(auVar167,auVar79,auVar76);
  auVar78 = vfmadd231ps_fma(auVar158,auVar79,auVar18);
  auVar18 = vfmadd231ps_fma(auVar155,auVar79,auVar21);
  auVar28 = vfmadd231ps_fma(auVar76,auVar187,auVar77);
  auVar131 = vfmadd231ps_fma(auVar78,auVar187,auVar197);
  auVar179._8_4_ = 0x7fffffff;
  auVar179._0_8_ = 0x7fffffff7fffffff;
  auVar179._12_4_ = 0x7fffffff;
  auVar132 = vfmadd231ps_fma(auVar18,auVar187,auVar20);
  auVar77 = vandps_avx(auVar179,auVar81);
  auVar176._8_4_ = 0x219392ef;
  auVar176._0_8_ = 0x219392ef219392ef;
  auVar176._12_4_ = 0x219392ef;
  uVar69 = vcmpps_avx512vl(auVar77,auVar176,1);
  bVar12 = (bool)((byte)uVar69 & 1);
  auVar73._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar81._0_4_;
  bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
  auVar73._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar81._4_4_;
  bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
  auVar73._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar81._8_4_;
  bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
  auVar73._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar81._12_4_;
  auVar77 = vandps_avx(auVar179,auVar26);
  uVar69 = vcmpps_avx512vl(auVar77,auVar176,1);
  bVar12 = (bool)((byte)uVar69 & 1);
  auVar74._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar26._0_4_;
  bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
  auVar74._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar26._4_4_;
  bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
  auVar74._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar26._8_4_;
  bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
  auVar74._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar26._12_4_;
  auVar77 = vandps_avx(auVar179,auVar27);
  uVar69 = vcmpps_avx512vl(auVar77,auVar176,1);
  bVar12 = (bool)((byte)uVar69 & 1);
  auVar75._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar27._0_4_;
  bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
  auVar75._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar27._4_4_;
  bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
  auVar75._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar27._8_4_;
  bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
  auVar75._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar27._12_4_;
  auVar76 = vrcp14ps_avx512vl(auVar73);
  auVar177._8_4_ = 0x3f800000;
  auVar177._0_8_ = 0x3f8000003f800000;
  auVar177._12_4_ = 0x3f800000;
  auVar77 = vfnmadd213ps_fma(auVar73,auVar76,auVar177);
  auVar81 = vfmadd132ps_fma(auVar77,auVar76,auVar76);
  auVar76 = vrcp14ps_avx512vl(auVar74);
  auVar77 = vfnmadd213ps_fma(auVar74,auVar76,auVar177);
  auVar27 = vfmadd132ps_fma(auVar77,auVar76,auVar76);
  auVar76 = vrcp14ps_avx512vl(auVar75);
  auVar77 = vfnmadd213ps_fma(auVar75,auVar76,auVar177);
  auVar25 = vfmadd132ps_fma(auVar77,auVar76,auVar76);
  fVar129 = (*(float *)(ray + k * 4 + 0x1c0) - *(float *)(prim + lVar24 + 0x16)) *
            *(float *)(prim + lVar24 + 0x1a);
  auVar173._4_4_ = fVar129;
  auVar173._0_4_ = fVar129;
  auVar173._8_4_ = fVar129;
  auVar173._12_4_ = fVar129;
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar61 * 7 + 6);
  auVar77 = vpmovsxwd_avx(auVar77);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar61 * 0xb + 6);
  auVar76 = vpmovsxwd_avx(auVar76);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar197 = vsubps_avx(auVar76,auVar77);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar61 * 9 + 6);
  auVar76 = vpmovsxwd_avx(auVar78);
  auVar78 = vfmadd213ps_fma(auVar197,auVar173,auVar77);
  auVar77 = vcvtdq2ps_avx(auVar76);
  auVar197._8_8_ = 0;
  auVar197._0_8_ = *(ulong *)(prim + uVar61 * 0xd + 6);
  auVar76 = vpmovsxwd_avx(auVar197);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar76 = vsubps_avx(auVar76,auVar77);
  auVar197 = vfmadd213ps_fma(auVar76,auVar173,auVar77);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar61 * 0x12 + 6);
  auVar77 = vpmovsxwd_avx(auVar18);
  auVar77 = vcvtdq2ps_avx(auVar77);
  uVar69 = (ulong)(uint)((int)(uVar61 * 5) << 2);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar61 * 2 + uVar69 + 6);
  auVar76 = vpmovsxwd_avx(auVar19);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar76 = vsubps_avx(auVar76,auVar77);
  auVar18 = vfmadd213ps_fma(auVar76,auVar173,auVar77);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar69 + 6);
  auVar77 = vpmovsxwd_avx(auVar20);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar61 * 0x18 + 6);
  auVar76 = vpmovsxwd_avx(auVar21);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar76 = vsubps_avx(auVar76,auVar77);
  auVar19 = vfmadd213ps_fma(auVar76,auVar173,auVar77);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar61 * 0x1d + 6);
  auVar77 = vpmovsxwd_avx(auVar22);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar61 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar76 = vpmovsxwd_avx(auVar79);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar76 = vsubps_avx(auVar76,auVar77);
  auVar20 = vfmadd213ps_fma(auVar76,auVar173,auVar77);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar61) + 6);
  auVar77 = vpmovsxwd_avx(auVar80);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar61 * 0x23 + 6);
  auVar76 = vpmovsxwd_avx(auVar26);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar76 = vsubps_avx(auVar76,auVar77);
  auVar76 = vfmadd213ps_fma(auVar76,auVar173,auVar77);
  auVar77 = vsubps_avx(auVar78,auVar28);
  auVar174._0_4_ = auVar81._0_4_ * auVar77._0_4_;
  auVar174._4_4_ = auVar81._4_4_ * auVar77._4_4_;
  auVar174._8_4_ = auVar81._8_4_ * auVar77._8_4_;
  auVar174._12_4_ = auVar81._12_4_ * auVar77._12_4_;
  auVar77 = vsubps_avx(auVar197,auVar28);
  auVar149._0_4_ = auVar81._0_4_ * auVar77._0_4_;
  auVar149._4_4_ = auVar81._4_4_ * auVar77._4_4_;
  auVar149._8_4_ = auVar81._8_4_ * auVar77._8_4_;
  auVar149._12_4_ = auVar81._12_4_ * auVar77._12_4_;
  auVar77 = vsubps_avx(auVar18,auVar131);
  auVar168._0_4_ = auVar27._0_4_ * auVar77._0_4_;
  auVar168._4_4_ = auVar27._4_4_ * auVar77._4_4_;
  auVar168._8_4_ = auVar27._8_4_ * auVar77._8_4_;
  auVar168._12_4_ = auVar27._12_4_ * auVar77._12_4_;
  auVar77 = vsubps_avx(auVar19,auVar131);
  auVar144._0_4_ = auVar27._0_4_ * auVar77._0_4_;
  auVar144._4_4_ = auVar27._4_4_ * auVar77._4_4_;
  auVar144._8_4_ = auVar27._8_4_ * auVar77._8_4_;
  auVar144._12_4_ = auVar27._12_4_ * auVar77._12_4_;
  auVar77 = vsubps_avx(auVar20,auVar132);
  auVar159._0_4_ = auVar25._0_4_ * auVar77._0_4_;
  auVar159._4_4_ = auVar25._4_4_ * auVar77._4_4_;
  auVar159._8_4_ = auVar25._8_4_ * auVar77._8_4_;
  auVar159._12_4_ = auVar25._12_4_ * auVar77._12_4_;
  auVar77 = vsubps_avx(auVar76,auVar132);
  auVar133._0_4_ = auVar25._0_4_ * auVar77._0_4_;
  auVar133._4_4_ = auVar25._4_4_ * auVar77._4_4_;
  auVar133._8_4_ = auVar25._8_4_ * auVar77._8_4_;
  auVar133._12_4_ = auVar25._12_4_ * auVar77._12_4_;
  auVar77 = vpminsd_avx(auVar174,auVar149);
  auVar76 = vpminsd_avx(auVar168,auVar144);
  auVar77 = vmaxps_avx(auVar77,auVar76);
  auVar76 = vpminsd_avx(auVar159,auVar133);
  uVar130 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar81._4_4_ = uVar130;
  auVar81._0_4_ = uVar130;
  auVar81._8_4_ = uVar130;
  auVar81._12_4_ = uVar130;
  auVar76 = vmaxps_avx512vl(auVar76,auVar81);
  auVar77 = vmaxps_avx(auVar77,auVar76);
  auVar27._8_4_ = 0x3f7ffffa;
  auVar27._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar27._12_4_ = 0x3f7ffffa;
  local_650 = vmulps_avx512vl(auVar77,auVar27);
  auVar77 = vpmaxsd_avx(auVar174,auVar149);
  auVar76 = vpmaxsd_avx(auVar168,auVar144);
  auVar77 = vminps_avx(auVar77,auVar76);
  auVar76 = vpmaxsd_avx(auVar159,auVar133);
  uVar130 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar25._4_4_ = uVar130;
  auVar25._0_4_ = uVar130;
  auVar25._8_4_ = uVar130;
  auVar25._12_4_ = uVar130;
  auVar76 = vminps_avx512vl(auVar76,auVar25);
  auVar77 = vminps_avx(auVar77,auVar76);
  auVar28._8_4_ = 0x3f800003;
  auVar28._0_8_ = 0x3f8000033f800003;
  auVar28._12_4_ = 0x3f800003;
  auVar77 = vmulps_avx512vl(auVar77,auVar28);
  auVar76 = vpbroadcastd_avx512vl();
  uVar142 = vcmpps_avx512vl(local_650,auVar77,2);
  uVar69 = vpcmpgtd_avx512vl(auVar76,_DAT_01f7fcf0);
  uVar69 = ((byte)uVar142 & 0xf) & uVar69;
  if ((char)uVar69 == '\0') {
    bVar70 = 0;
  }
  else {
    local_7d0 = pre->ray_space + k;
    auVar139 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_300 = vmovdqa64_avx512f(auVar139);
    local_7c8 = prim;
    do {
      lVar24 = 0;
      for (uVar61 = uVar69; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000) {
        lVar24 = lVar24 + 1;
      }
      uVar7 = *(uint *)(local_7c8 + 2);
      pGVar9 = (context->scene->geometries).items[uVar7].ptr;
      local_4c0._0_8_ = CONCAT44(0,*(uint *)(local_7c8 + lVar24 * 4 + 6));
      uVar61 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                               CONCAT44(0,*(uint *)(local_7c8 + lVar24 * 4 + 6)) *
                               pGVar9[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar129 = (pGVar9->time_range).lower;
      fVar129 = pGVar9->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x1c0) - fVar129) /
                ((pGVar9->time_range).upper - fVar129));
      auVar77 = vroundss_avx(ZEXT416((uint)fVar129),ZEXT416((uint)fVar129),9);
      auVar77 = vminss_avx(auVar77,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
      auVar77 = vmaxss_avx(ZEXT816(0) << 0x20,auVar77);
      fVar129 = fVar129 - auVar77._0_4_;
      _Var10 = pGVar9[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar63 = (long)(int)auVar77._0_4_ * 0x38;
      lVar24 = *(long *)(_Var10 + 0x10 + lVar63);
      lVar68 = *(long *)(_Var10 + 0x38 + lVar63);
      lVar62 = *(long *)(_Var10 + 0x48 + lVar63);
      auVar145._4_4_ = fVar129;
      auVar145._0_4_ = fVar129;
      auVar145._8_4_ = fVar129;
      auVar145._12_4_ = fVar129;
      pfVar3 = (float *)(lVar68 + uVar61 * lVar62);
      auVar180._0_4_ = fVar129 * *pfVar3;
      auVar180._4_4_ = fVar129 * pfVar3[1];
      auVar180._8_4_ = fVar129 * pfVar3[2];
      auVar180._12_4_ = fVar129 * pfVar3[3];
      pfVar3 = (float *)(lVar68 + (uVar61 + 1) * lVar62);
      auVar181._0_4_ = fVar129 * *pfVar3;
      auVar181._4_4_ = fVar129 * pfVar3[1];
      auVar181._8_4_ = fVar129 * pfVar3[2];
      auVar181._12_4_ = fVar129 * pfVar3[3];
      uVar64 = (uVar61 + 2) * lVar62;
      auVar77 = vmulps_avx512vl(auVar145,*(undefined1 (*) [16])(lVar68 + uVar64));
      auVar76 = vmulps_avx512vl(auVar145,*(undefined1 (*) [16])(lVar68 + lVar62 * (uVar61 + 3)));
      lVar68 = *(long *)(_Var10 + lVar63);
      fVar129 = 1.0 - fVar129;
      auVar134._4_4_ = fVar129;
      auVar134._0_4_ = fVar129;
      auVar134._8_4_ = fVar129;
      auVar134._12_4_ = fVar129;
      local_870 = vfmadd231ps_fma(auVar180,auVar134,*(undefined1 (*) [16])(lVar68 + lVar24 * uVar61)
                                 );
      local_880 = vfmadd231ps_fma(auVar181,auVar134,
                                  *(undefined1 (*) [16])(lVar68 + lVar24 * (uVar61 + 1)));
      local_890 = vfmadd231ps_avx512vl
                            (auVar77,auVar134,*(undefined1 (*) [16])(lVar68 + lVar24 * (uVar61 + 2))
                            );
      _local_710 = vfmadd231ps_avx512vl
                             (auVar76,auVar134,
                              *(undefined1 (*) [16])(lVar68 + lVar24 * (uVar61 + 3)));
      iVar8 = (int)pGVar9[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar77 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40))
                              ,0x1c);
      lVar24 = (long)iVar8 * 0x44;
      auVar77 = vinsertps_avx(auVar77,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
      auVar78 = vsubps_avx(local_870,auVar77);
      uVar130 = auVar78._0_4_;
      auVar150._4_4_ = uVar130;
      auVar150._0_4_ = uVar130;
      auVar150._8_4_ = uVar130;
      auVar150._12_4_ = uVar130;
      auVar76 = vshufps_avx(auVar78,auVar78,0x55);
      aVar4 = (local_7d0->vx).field_0;
      aVar5 = (local_7d0->vy).field_0;
      fVar129 = (local_7d0->vz).field_0.m128[0];
      fVar153 = *(float *)((long)&(local_7d0->vz).field_0 + 4);
      fVar140 = *(float *)((long)&(local_7d0->vz).field_0 + 8);
      fVar141 = *(float *)((long)&(local_7d0->vz).field_0 + 0xc);
      auVar78 = vshufps_avx(auVar78,auVar78,0xaa);
      auVar183._0_4_ = fVar129 * auVar78._0_4_;
      auVar183._4_4_ = fVar153 * auVar78._4_4_;
      auVar183._8_4_ = fVar140 * auVar78._8_4_;
      auVar183._12_4_ = fVar141 * auVar78._12_4_;
      auVar76 = vfmadd231ps_fma(auVar183,(undefined1  [16])aVar5,auVar76);
      auVar197 = vfmadd231ps_fma(auVar76,(undefined1  [16])aVar4,auVar150);
      auVar78 = vsubps_avx(local_880,auVar77);
      uVar130 = auVar78._0_4_;
      auVar151._4_4_ = uVar130;
      auVar151._0_4_ = uVar130;
      auVar151._8_4_ = uVar130;
      auVar151._12_4_ = uVar130;
      auVar76 = vshufps_avx(auVar78,auVar78,0x55);
      auVar78 = vshufps_avx(auVar78,auVar78,0xaa);
      auVar184._0_4_ = fVar129 * auVar78._0_4_;
      auVar184._4_4_ = fVar153 * auVar78._4_4_;
      auVar184._8_4_ = fVar140 * auVar78._8_4_;
      auVar184._12_4_ = fVar141 * auVar78._12_4_;
      auVar76 = vfmadd231ps_fma(auVar184,(undefined1  [16])aVar5,auVar76);
      auVar18 = vfmadd231ps_fma(auVar76,(undefined1  [16])aVar4,auVar151);
      auVar78 = vsubps_avx512vl(local_890,auVar77);
      uVar130 = auVar78._0_4_;
      auVar152._4_4_ = uVar130;
      auVar152._0_4_ = uVar130;
      auVar152._8_4_ = uVar130;
      auVar152._12_4_ = uVar130;
      auVar76 = vshufps_avx(auVar78,auVar78,0x55);
      auVar78 = vshufps_avx(auVar78,auVar78,0xaa);
      auVar185._0_4_ = fVar129 * auVar78._0_4_;
      auVar185._4_4_ = fVar153 * auVar78._4_4_;
      auVar185._8_4_ = fVar140 * auVar78._8_4_;
      auVar185._12_4_ = fVar141 * auVar78._12_4_;
      auVar76 = vfmadd231ps_fma(auVar185,(undefined1  [16])aVar5,auVar76);
      auVar78 = vfmadd231ps_fma(auVar76,(undefined1  [16])aVar4,auVar152);
      auVar76 = vsubps_avx512vl(_local_710,auVar77);
      uVar130 = auVar76._0_4_;
      auVar146._4_4_ = uVar130;
      auVar146._0_4_ = uVar130;
      auVar146._8_4_ = uVar130;
      auVar146._12_4_ = uVar130;
      auVar77 = vshufps_avx(auVar76,auVar76,0x55);
      auVar76 = vshufps_avx(auVar76,auVar76,0xaa);
      auVar189._0_4_ = fVar129 * auVar76._0_4_;
      auVar189._4_4_ = fVar153 * auVar76._4_4_;
      auVar189._8_4_ = fVar140 * auVar76._8_4_;
      auVar189._12_4_ = fVar141 * auVar76._12_4_;
      auVar77 = vfmadd231ps_fma(auVar189,(undefined1  [16])aVar5,auVar77);
      auVar19 = vfmadd231ps_fma(auVar77,(undefined1  [16])aVar4,auVar146);
      auVar97 = *(undefined1 (*) [32])(bspline_basis0 + lVar24);
      uVar130 = auVar197._0_4_;
      local_760._4_4_ = uVar130;
      local_760._0_4_ = uVar130;
      local_760._8_4_ = uVar130;
      local_760._12_4_ = uVar130;
      local_760._16_4_ = uVar130;
      local_760._20_4_ = uVar130;
      local_760._24_4_ = uVar130;
      local_760._28_4_ = uVar130;
      auVar99 = *(undefined1 (*) [32])(bspline_basis0 + lVar24 + 0x484);
      auVar82._8_4_ = 1;
      auVar82._0_8_ = 0x100000001;
      auVar82._12_4_ = 1;
      auVar82._16_4_ = 1;
      auVar82._20_4_ = 1;
      auVar82._24_4_ = 1;
      auVar82._28_4_ = 1;
      local_780 = vpermps_avx2(auVar82,ZEXT1632(auVar197));
      uVar130 = auVar18._0_4_;
      local_8c0._4_4_ = uVar130;
      local_8c0._0_4_ = uVar130;
      local_8c0._8_4_ = uVar130;
      local_8c0._12_4_ = uVar130;
      local_8c0._16_4_ = uVar130;
      local_8c0._20_4_ = uVar130;
      local_8c0._24_4_ = uVar130;
      local_8c0._28_4_ = uVar130;
      local_8e0 = vpermps_avx512vl(auVar82,ZEXT1632(auVar18));
      auVar95 = *(undefined1 (*) [32])(bspline_basis0 + lVar24 + 0x908);
      local_800 = vbroadcastss_avx512vl(auVar78);
      auVar203 = ZEXT3264(local_800);
      local_820 = vpermps_avx512vl(auVar82,ZEXT1632(auVar78));
      auVar94 = *(undefined1 (*) [32])(bspline_basis0 + lVar24 + 0xd8c);
      local_840 = vbroadcastss_avx512vl(auVar19);
      auVar139 = ZEXT3264(local_840);
      local_860 = vpermps_avx512vl(auVar82,ZEXT1632(auVar19));
      auVar202 = ZEXT3264(local_860);
      auVar82 = vmulps_avx512vl(local_840,auVar94);
      auVar83 = vmulps_avx512vl(local_860,auVar94);
      auVar82 = vfmadd231ps_avx512vl(auVar82,auVar95,local_800);
      auVar83 = vfmadd231ps_avx512vl(auVar83,auVar95,local_820);
      auVar77 = vfmadd231ps_fma(auVar82,auVar99,local_8c0);
      auVar84 = vfmadd231ps_avx512vl(auVar83,auVar99,local_8e0);
      auVar85 = vfmadd231ps_avx512vl(ZEXT1632(auVar77),auVar97,local_760);
      auVar82 = *(undefined1 (*) [32])(bspline_basis1 + lVar24);
      auVar83 = *(undefined1 (*) [32])(bspline_basis1 + lVar24 + 0x484);
      auVar93 = *(undefined1 (*) [32])(bspline_basis1 + lVar24 + 0x908);
      auVar86 = vfmadd231ps_avx512vl(auVar84,auVar97,local_780);
      auVar84 = *(undefined1 (*) [32])(bspline_basis1 + lVar24 + 0xd8c);
      auVar87 = vmulps_avx512vl(local_840,auVar84);
      auVar88 = vmulps_avx512vl(local_860,auVar84);
      auVar87 = vfmadd231ps_avx512vl(auVar87,auVar93,local_800);
      auVar88 = vfmadd231ps_avx512vl(auVar88,auVar93,local_820);
      auVar87 = vfmadd231ps_avx512vl(auVar87,auVar83,local_8c0);
      auVar88 = vfmadd231ps_avx512vl(auVar88,auVar83,local_8e0);
      auVar20 = vfmadd231ps_fma(auVar87,auVar82,local_760);
      auVar21 = vfmadd231ps_fma(auVar88,auVar82,local_780);
      auVar88 = vsubps_avx512vl(ZEXT1632(auVar20),auVar85);
      auVar89 = vsubps_avx512vl(ZEXT1632(auVar21),auVar86);
      auVar87 = vmulps_avx512vl(auVar86,auVar88);
      auVar90 = vmulps_avx512vl(auVar85,auVar89);
      auVar87 = vsubps_avx512vl(auVar87,auVar90);
      auVar77 = vshufps_avx(local_870,local_870,0xff);
      uVar142 = auVar77._0_8_;
      local_320._8_8_ = uVar142;
      local_320._0_8_ = uVar142;
      local_320._16_8_ = uVar142;
      local_320._24_8_ = uVar142;
      auVar77 = vshufps_avx(local_880,local_880,0xff);
      local_340 = vbroadcastsd_avx512vl(auVar77);
      auVar77 = vshufps_avx512vl(local_890,local_890,0xff);
      local_360 = vbroadcastsd_avx512vl(auVar77);
      auVar77 = vshufps_avx512vl(_local_710,_local_710,0xff);
      uVar142 = auVar77._0_8_;
      register0x000012c8 = uVar142;
      local_380 = uVar142;
      register0x000012d0 = uVar142;
      register0x000012d8 = uVar142;
      auVar90 = vmulps_avx512vl(_local_380,auVar94);
      auVar90 = vfmadd231ps_avx512vl(auVar90,auVar95,local_360);
      auVar90 = vfmadd231ps_avx512vl(auVar90,auVar99,local_340);
      auVar90 = vfmadd231ps_avx512vl(auVar90,auVar97,local_320);
      auVar91 = vmulps_avx512vl(_local_380,auVar84);
      auVar91 = vfmadd231ps_avx512vl(auVar91,auVar93,local_360);
      auVar91 = vfmadd231ps_avx512vl(auVar91,auVar83,local_340);
      auVar22 = vfmadd231ps_fma(auVar91,auVar82,local_320);
      auVar91 = vmulps_avx512vl(auVar89,auVar89);
      auVar91 = vfmadd231ps_avx512vl(auVar91,auVar88,auVar88);
      auVar92 = vmaxps_avx512vl(auVar90,ZEXT1632(auVar22));
      auVar92 = vmulps_avx512vl(auVar92,auVar92);
      auVar91 = vmulps_avx512vl(auVar92,auVar91);
      auVar87 = vmulps_avx512vl(auVar87,auVar87);
      uVar142 = vcmpps_avx512vl(auVar87,auVar91,2);
      auVar77 = vblendps_avx(auVar197,local_870,8);
      auVar79 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar76 = vandps_avx512vl(auVar77,auVar79);
      auVar77 = vblendps_avx(auVar18,local_880,8);
      auVar77 = vandps_avx512vl(auVar77,auVar79);
      auVar76 = vmaxps_avx(auVar76,auVar77);
      auVar77 = vblendps_avx(auVar78,local_890,8);
      auVar80 = vandps_avx512vl(auVar77,auVar79);
      auVar77 = vblendps_avx(auVar19,_local_710,8);
      auVar77 = vandps_avx512vl(auVar77,auVar79);
      auVar77 = vmaxps_avx(auVar80,auVar77);
      auVar77 = vmaxps_avx(auVar76,auVar77);
      auVar76 = vmovshdup_avx(auVar77);
      auVar76 = vmaxss_avx(auVar76,auVar77);
      auVar77 = vshufpd_avx(auVar77,auVar77,1);
      auVar77 = vmaxss_avx(auVar77,auVar76);
      auVar76 = vcvtsi2ss_avx512f(local_890,iVar8);
      local_500._0_16_ = auVar76;
      auVar91._0_4_ = auVar76._0_4_;
      auVar91._4_4_ = auVar91._0_4_;
      auVar91._8_4_ = auVar91._0_4_;
      auVar91._12_4_ = auVar91._0_4_;
      auVar91._16_4_ = auVar91._0_4_;
      auVar91._20_4_ = auVar91._0_4_;
      auVar91._24_4_ = auVar91._0_4_;
      auVar91._28_4_ = auVar91._0_4_;
      uVar23 = vcmpps_avx512vl(auVar91,_DAT_01faff40,0xe);
      bVar70 = (byte)uVar142 & (byte)uVar23;
      fVar129 = auVar77._0_4_ * 4.7683716e-07;
      auVar87._8_4_ = 2;
      auVar87._0_8_ = 0x200000002;
      auVar87._12_4_ = 2;
      auVar87._16_4_ = 2;
      auVar87._20_4_ = 2;
      auVar87._24_4_ = 2;
      auVar87._28_4_ = 2;
      local_3a0 = vpermps_avx512vl(auVar87,ZEXT1632(auVar197));
      local_3c0 = vpermps_avx512vl(auVar87,ZEXT1632(auVar18));
      local_3e0 = vpermps_avx512vl(auVar87,ZEXT1632(auVar78));
      auVar87 = vpermps_avx2(auVar87,ZEXT1632(auVar19));
      uVar67 = *(uint *)(ray + k * 4 + 0xc0);
      auVar77 = local_3a0._0_16_;
      if (bVar70 == 0) {
        uVar64 = 0;
        auVar97 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar196 = ZEXT3264(auVar97);
        auVar77 = vxorps_avx512vl(auVar77,auVar77);
        auVar198 = ZEXT1664(auVar77);
        auVar199 = ZEXT3264(local_760);
        auVar200 = ZEXT3264(local_780);
        auVar195 = ZEXT3264(local_8c0);
        auVar194 = ZEXT3264(local_8e0);
        auVar201 = ZEXT3264(local_820);
      }
      else {
        local_7c0._0_16_ = ZEXT416(uVar67);
        auVar84 = vmulps_avx512vl(auVar87,auVar84);
        auVar93 = vfmadd213ps_avx512vl(auVar93,local_3e0,auVar84);
        auVar83 = vfmadd213ps_avx512vl(auVar83,local_3c0,auVar93);
        auVar92 = vfmadd213ps_avx512vl(auVar82,local_3a0,auVar83);
        auVar94 = vmulps_avx512vl(auVar87,auVar94);
        auVar95 = vfmadd213ps_avx512vl(auVar95,local_3e0,auVar94);
        auVar83 = vfmadd213ps_avx512vl(auVar99,local_3c0,auVar95);
        auVar99 = *(undefined1 (*) [32])(bspline_basis0 + lVar24 + 0x1210);
        auVar95 = *(undefined1 (*) [32])(bspline_basis0 + lVar24 + 0x1694);
        auVar94 = *(undefined1 (*) [32])(bspline_basis0 + lVar24 + 0x1b18);
        auVar82 = *(undefined1 (*) [32])(bspline_basis0 + lVar24 + 0x1f9c);
        auVar96 = vfmadd213ps_avx512vl(auVar97,local_3a0,auVar83);
        auVar97 = vmulps_avx512vl(local_840,auVar82);
        auVar83 = vmulps_avx512vl(local_860,auVar82);
        auVar186._0_4_ = auVar87._0_4_ * auVar82._0_4_;
        auVar186._4_4_ = auVar87._4_4_ * auVar82._4_4_;
        auVar186._8_4_ = auVar87._8_4_ * auVar82._8_4_;
        auVar186._12_4_ = auVar87._12_4_ * auVar82._12_4_;
        auVar186._16_4_ = auVar87._16_4_ * auVar82._16_4_;
        auVar186._20_4_ = auVar87._20_4_ * auVar82._20_4_;
        auVar186._24_4_ = auVar87._24_4_ * auVar82._24_4_;
        auVar186._28_4_ = 0;
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar94,local_800);
        auVar82 = vfmadd231ps_avx512vl(auVar83,auVar94,local_820);
        auVar94 = vfmadd231ps_avx512vl(auVar186,local_3e0,auVar94);
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar95,local_8c0);
        auVar82 = vfmadd231ps_avx512vl(auVar82,auVar95,local_8e0);
        auVar83 = vfmadd231ps_avx512vl(auVar94,local_3c0,auVar95);
        auVar93 = vfmadd231ps_avx512vl(auVar97,auVar99,local_760);
        auVar82 = vfmadd231ps_avx512vl(auVar82,auVar99,local_780);
        auVar97 = *(undefined1 (*) [32])(bspline_basis1 + lVar24 + 0x1210);
        auVar95 = *(undefined1 (*) [32])(bspline_basis1 + lVar24 + 0x1b18);
        auVar94 = *(undefined1 (*) [32])(bspline_basis1 + lVar24 + 0x1f9c);
        auVar83 = vfmadd231ps_avx512vl(auVar83,local_3a0,auVar99);
        auVar84 = vmulps_avx512vl(local_840,auVar94);
        auVar98 = vmulps_avx512vl(local_860,auVar94);
        auVar99._4_4_ = auVar87._4_4_ * auVar94._4_4_;
        auVar99._0_4_ = auVar87._0_4_ * auVar94._0_4_;
        auVar99._8_4_ = auVar87._8_4_ * auVar94._8_4_;
        auVar99._12_4_ = auVar87._12_4_ * auVar94._12_4_;
        auVar99._16_4_ = auVar87._16_4_ * auVar94._16_4_;
        auVar99._20_4_ = auVar87._20_4_ * auVar94._20_4_;
        auVar99._24_4_ = auVar87._24_4_ * auVar94._24_4_;
        auVar99._28_4_ = auVar94._28_4_;
        auVar94 = vfmadd231ps_avx512vl(auVar84,auVar95,local_800);
        auVar84 = vfmadd231ps_avx512vl(auVar98,auVar95,local_820);
        auVar95 = vfmadd231ps_avx512vl(auVar99,local_3e0,auVar95);
        auVar99 = *(undefined1 (*) [32])(bspline_basis1 + lVar24 + 0x1694);
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar99,local_8c0);
        auVar84 = vfmadd231ps_avx512vl(auVar84,auVar99,local_8e0);
        auVar99 = vfmadd231ps_avx512vl(auVar95,local_3c0,auVar99);
        auVar95 = vfmadd231ps_avx512vl(auVar94,auVar97,local_760);
        auVar94 = vfmadd231ps_avx512vl(auVar84,auVar97,local_780);
        auVar84 = vfmadd231ps_avx512vl(auVar99,local_3a0,auVar97);
        auVar190._8_4_ = 0x7fffffff;
        auVar190._0_8_ = 0x7fffffff7fffffff;
        auVar190._12_4_ = 0x7fffffff;
        auVar190._16_4_ = 0x7fffffff;
        auVar190._20_4_ = 0x7fffffff;
        auVar190._24_4_ = 0x7fffffff;
        auVar190._28_4_ = 0x7fffffff;
        auVar97 = vandps_avx(auVar93,auVar190);
        auVar99 = vandps_avx(auVar82,auVar190);
        auVar99 = vmaxps_avx(auVar97,auVar99);
        auVar97 = vandps_avx(auVar83,auVar190);
        auVar97 = vmaxps_avx(auVar99,auVar97);
        auVar83 = vbroadcastss_avx512vl(ZEXT416((uint)fVar129));
        uVar61 = vcmpps_avx512vl(auVar97,auVar83,1);
        bVar12 = (bool)((byte)uVar61 & 1);
        auVar98._0_4_ = (float)((uint)bVar12 * auVar88._0_4_ | (uint)!bVar12 * auVar93._0_4_);
        bVar12 = (bool)((byte)(uVar61 >> 1) & 1);
        auVar98._4_4_ = (float)((uint)bVar12 * auVar88._4_4_ | (uint)!bVar12 * auVar93._4_4_);
        bVar12 = (bool)((byte)(uVar61 >> 2) & 1);
        auVar98._8_4_ = (float)((uint)bVar12 * auVar88._8_4_ | (uint)!bVar12 * auVar93._8_4_);
        bVar12 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar98._12_4_ = (float)((uint)bVar12 * auVar88._12_4_ | (uint)!bVar12 * auVar93._12_4_);
        bVar12 = (bool)((byte)(uVar61 >> 4) & 1);
        auVar98._16_4_ = (float)((uint)bVar12 * auVar88._16_4_ | (uint)!bVar12 * auVar93._16_4_);
        bVar12 = (bool)((byte)(uVar61 >> 5) & 1);
        auVar98._20_4_ = (float)((uint)bVar12 * auVar88._20_4_ | (uint)!bVar12 * auVar93._20_4_);
        bVar12 = (bool)((byte)(uVar61 >> 6) & 1);
        auVar98._24_4_ = (float)((uint)bVar12 * auVar88._24_4_ | (uint)!bVar12 * auVar93._24_4_);
        bVar12 = SUB81(uVar61 >> 7,0);
        auVar98._28_4_ = (uint)bVar12 * auVar88._28_4_ | (uint)!bVar12 * auVar93._28_4_;
        bVar12 = (bool)((byte)uVar61 & 1);
        auVar100._0_4_ = (float)((uint)bVar12 * auVar89._0_4_ | (uint)!bVar12 * auVar82._0_4_);
        bVar12 = (bool)((byte)(uVar61 >> 1) & 1);
        auVar100._4_4_ = (float)((uint)bVar12 * auVar89._4_4_ | (uint)!bVar12 * auVar82._4_4_);
        bVar12 = (bool)((byte)(uVar61 >> 2) & 1);
        auVar100._8_4_ = (float)((uint)bVar12 * auVar89._8_4_ | (uint)!bVar12 * auVar82._8_4_);
        bVar12 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar100._12_4_ = (float)((uint)bVar12 * auVar89._12_4_ | (uint)!bVar12 * auVar82._12_4_);
        bVar12 = (bool)((byte)(uVar61 >> 4) & 1);
        auVar100._16_4_ = (float)((uint)bVar12 * auVar89._16_4_ | (uint)!bVar12 * auVar82._16_4_);
        bVar12 = (bool)((byte)(uVar61 >> 5) & 1);
        auVar100._20_4_ = (float)((uint)bVar12 * auVar89._20_4_ | (uint)!bVar12 * auVar82._20_4_);
        bVar12 = (bool)((byte)(uVar61 >> 6) & 1);
        auVar100._24_4_ = (float)((uint)bVar12 * auVar89._24_4_ | (uint)!bVar12 * auVar82._24_4_);
        bVar12 = SUB81(uVar61 >> 7,0);
        auVar100._28_4_ = (uint)bVar12 * auVar89._28_4_ | (uint)!bVar12 * auVar82._28_4_;
        auVar97 = vandps_avx(auVar190,auVar95);
        auVar99 = vandps_avx(auVar94,auVar190);
        auVar99 = vmaxps_avx(auVar97,auVar99);
        auVar97 = vandps_avx(auVar84,auVar190);
        auVar97 = vmaxps_avx(auVar99,auVar97);
        uVar61 = vcmpps_avx512vl(auVar97,auVar83,1);
        bVar12 = (bool)((byte)uVar61 & 1);
        auVar101._0_4_ = (float)((uint)bVar12 * auVar88._0_4_ | (uint)!bVar12 * auVar95._0_4_);
        bVar12 = (bool)((byte)(uVar61 >> 1) & 1);
        auVar101._4_4_ = (float)((uint)bVar12 * auVar88._4_4_ | (uint)!bVar12 * auVar95._4_4_);
        bVar12 = (bool)((byte)(uVar61 >> 2) & 1);
        auVar101._8_4_ = (float)((uint)bVar12 * auVar88._8_4_ | (uint)!bVar12 * auVar95._8_4_);
        bVar12 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar101._12_4_ = (float)((uint)bVar12 * auVar88._12_4_ | (uint)!bVar12 * auVar95._12_4_);
        bVar12 = (bool)((byte)(uVar61 >> 4) & 1);
        auVar101._16_4_ = (float)((uint)bVar12 * auVar88._16_4_ | (uint)!bVar12 * auVar95._16_4_);
        bVar12 = (bool)((byte)(uVar61 >> 5) & 1);
        auVar101._20_4_ = (float)((uint)bVar12 * auVar88._20_4_ | (uint)!bVar12 * auVar95._20_4_);
        bVar12 = (bool)((byte)(uVar61 >> 6) & 1);
        auVar101._24_4_ = (float)((uint)bVar12 * auVar88._24_4_ | (uint)!bVar12 * auVar95._24_4_);
        bVar12 = SUB81(uVar61 >> 7,0);
        auVar101._28_4_ = (uint)bVar12 * auVar88._28_4_ | (uint)!bVar12 * auVar95._28_4_;
        bVar12 = (bool)((byte)uVar61 & 1);
        auVar102._0_4_ = (float)((uint)bVar12 * auVar89._0_4_ | (uint)!bVar12 * auVar94._0_4_);
        bVar12 = (bool)((byte)(uVar61 >> 1) & 1);
        auVar102._4_4_ = (float)((uint)bVar12 * auVar89._4_4_ | (uint)!bVar12 * auVar94._4_4_);
        bVar12 = (bool)((byte)(uVar61 >> 2) & 1);
        auVar102._8_4_ = (float)((uint)bVar12 * auVar89._8_4_ | (uint)!bVar12 * auVar94._8_4_);
        bVar12 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar102._12_4_ = (float)((uint)bVar12 * auVar89._12_4_ | (uint)!bVar12 * auVar94._12_4_);
        bVar12 = (bool)((byte)(uVar61 >> 4) & 1);
        auVar102._16_4_ = (float)((uint)bVar12 * auVar89._16_4_ | (uint)!bVar12 * auVar94._16_4_);
        bVar12 = (bool)((byte)(uVar61 >> 5) & 1);
        auVar102._20_4_ = (float)((uint)bVar12 * auVar89._20_4_ | (uint)!bVar12 * auVar94._20_4_);
        bVar12 = (bool)((byte)(uVar61 >> 6) & 1);
        auVar102._24_4_ = (float)((uint)bVar12 * auVar89._24_4_ | (uint)!bVar12 * auVar94._24_4_);
        bVar12 = SUB81(uVar61 >> 7,0);
        auVar102._28_4_ = (uint)bVar12 * auVar89._28_4_ | (uint)!bVar12 * auVar94._28_4_;
        auVar81 = vxorps_avx512vl(auVar77,auVar77);
        auVar198 = ZEXT1664(auVar81);
        auVar97 = vfmadd213ps_avx512vl(auVar98,auVar98,ZEXT1632(auVar81));
        auVar77 = vfmadd231ps_fma(auVar97,auVar100,auVar100);
        auVar99 = vrsqrt14ps_avx512vl(ZEXT1632(auVar77));
        fVar153 = auVar99._0_4_;
        fVar140 = auVar99._4_4_;
        fVar141 = auVar99._8_4_;
        fVar172 = auVar99._12_4_;
        fVar171 = auVar99._16_4_;
        fVar175 = auVar99._20_4_;
        fVar71 = auVar99._24_4_;
        auVar97._4_4_ = fVar140 * fVar140 * fVar140 * auVar77._4_4_ * -0.5;
        auVar97._0_4_ = fVar153 * fVar153 * fVar153 * auVar77._0_4_ * -0.5;
        auVar97._8_4_ = fVar141 * fVar141 * fVar141 * auVar77._8_4_ * -0.5;
        auVar97._12_4_ = fVar172 * fVar172 * fVar172 * auVar77._12_4_ * -0.5;
        auVar97._16_4_ = fVar171 * fVar171 * fVar171 * -0.0;
        auVar97._20_4_ = fVar175 * fVar175 * fVar175 * -0.0;
        auVar97._24_4_ = fVar71 * fVar71 * fVar71 * -0.0;
        auVar97._28_4_ = auVar84._28_4_;
        auVar82 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar82,auVar99);
        auVar95._4_4_ = auVar100._4_4_ * auVar97._4_4_;
        auVar95._0_4_ = auVar100._0_4_ * auVar97._0_4_;
        auVar95._8_4_ = auVar100._8_4_ * auVar97._8_4_;
        auVar95._12_4_ = auVar100._12_4_ * auVar97._12_4_;
        auVar95._16_4_ = auVar100._16_4_ * auVar97._16_4_;
        auVar95._20_4_ = auVar100._20_4_ * auVar97._20_4_;
        auVar95._24_4_ = auVar100._24_4_ * auVar97._24_4_;
        auVar95._28_4_ = 0;
        auVar94._4_4_ = auVar97._4_4_ * -auVar98._4_4_;
        auVar94._0_4_ = auVar97._0_4_ * -auVar98._0_4_;
        auVar94._8_4_ = auVar97._8_4_ * -auVar98._8_4_;
        auVar94._12_4_ = auVar97._12_4_ * -auVar98._12_4_;
        auVar94._16_4_ = auVar97._16_4_ * -auVar98._16_4_;
        auVar94._20_4_ = auVar97._20_4_ * -auVar98._20_4_;
        auVar94._24_4_ = auVar97._24_4_ * -auVar98._24_4_;
        auVar94._28_4_ = auVar100._28_4_;
        auVar97 = vmulps_avx512vl(auVar97,ZEXT1632(auVar81));
        auVar88 = ZEXT1632(auVar81);
        auVar99 = vfmadd213ps_avx512vl(auVar101,auVar101,auVar88);
        auVar77 = vfmadd231ps_fma(auVar99,auVar102,auVar102);
        auVar99 = vrsqrt14ps_avx512vl(ZEXT1632(auVar77));
        fVar153 = auVar99._0_4_;
        fVar140 = auVar99._4_4_;
        fVar141 = auVar99._8_4_;
        fVar172 = auVar99._12_4_;
        fVar171 = auVar99._16_4_;
        fVar175 = auVar99._20_4_;
        fVar71 = auVar99._24_4_;
        auVar83._4_4_ = fVar140 * fVar140 * fVar140 * auVar77._4_4_ * -0.5;
        auVar83._0_4_ = fVar153 * fVar153 * fVar153 * auVar77._0_4_ * -0.5;
        auVar83._8_4_ = fVar141 * fVar141 * fVar141 * auVar77._8_4_ * -0.5;
        auVar83._12_4_ = fVar172 * fVar172 * fVar172 * auVar77._12_4_ * -0.5;
        auVar83._16_4_ = fVar171 * fVar171 * fVar171 * -0.0;
        auVar83._20_4_ = fVar175 * fVar175 * fVar175 * -0.0;
        auVar83._24_4_ = fVar71 * fVar71 * fVar71 * -0.0;
        auVar83._28_4_ = 0;
        auVar82 = vfmadd231ps_avx512vl(auVar83,auVar82,auVar99);
        auVar93._4_4_ = auVar102._4_4_ * auVar82._4_4_;
        auVar93._0_4_ = auVar102._0_4_ * auVar82._0_4_;
        auVar93._8_4_ = auVar102._8_4_ * auVar82._8_4_;
        auVar93._12_4_ = auVar102._12_4_ * auVar82._12_4_;
        auVar93._16_4_ = auVar102._16_4_ * auVar82._16_4_;
        auVar93._20_4_ = auVar102._20_4_ * auVar82._20_4_;
        auVar93._24_4_ = auVar102._24_4_ * auVar82._24_4_;
        auVar93._28_4_ = auVar99._28_4_;
        auVar84._4_4_ = -auVar101._4_4_ * auVar82._4_4_;
        auVar84._0_4_ = -auVar101._0_4_ * auVar82._0_4_;
        auVar84._8_4_ = -auVar101._8_4_ * auVar82._8_4_;
        auVar84._12_4_ = -auVar101._12_4_ * auVar82._12_4_;
        auVar84._16_4_ = -auVar101._16_4_ * auVar82._16_4_;
        auVar84._20_4_ = -auVar101._20_4_ * auVar82._20_4_;
        auVar84._24_4_ = -auVar101._24_4_ * auVar82._24_4_;
        auVar84._28_4_ = auVar101._28_4_ ^ 0x80000000;
        auVar99 = vmulps_avx512vl(auVar82,auVar88);
        auVar77 = vfmadd213ps_fma(auVar95,auVar90,auVar85);
        auVar76 = vfmadd213ps_fma(auVar94,auVar90,auVar86);
        auVar82 = vfmadd213ps_avx512vl(auVar97,auVar90,auVar96);
        auVar83 = vfmadd213ps_avx512vl(auVar93,ZEXT1632(auVar22),ZEXT1632(auVar20));
        auVar79 = vfnmadd213ps_fma(auVar95,auVar90,auVar85);
        auVar85 = ZEXT1632(auVar22);
        auVar78 = vfmadd213ps_fma(auVar84,auVar85,ZEXT1632(auVar21));
        auVar80 = vfnmadd213ps_fma(auVar94,auVar90,auVar86);
        auVar197 = vfmadd213ps_fma(auVar99,auVar85,auVar92);
        auVar95 = vfnmadd231ps_avx512vl(auVar96,auVar90,auVar97);
        auVar20 = vfnmadd213ps_fma(auVar93,auVar85,ZEXT1632(auVar20));
        auVar21 = vfnmadd213ps_fma(auVar84,auVar85,ZEXT1632(auVar21));
        auVar26 = vfnmadd231ps_fma(auVar92,ZEXT1632(auVar22),auVar99);
        auVar99 = vsubps_avx512vl(auVar83,ZEXT1632(auVar79));
        auVar97 = vsubps_avx(ZEXT1632(auVar78),ZEXT1632(auVar80));
        auVar94 = vsubps_avx512vl(ZEXT1632(auVar197),auVar95);
        auVar93 = vmulps_avx512vl(auVar97,auVar95);
        auVar18 = vfmsub231ps_fma(auVar93,ZEXT1632(auVar80),auVar94);
        auVar85._4_4_ = auVar79._4_4_ * auVar94._4_4_;
        auVar85._0_4_ = auVar79._0_4_ * auVar94._0_4_;
        auVar85._8_4_ = auVar79._8_4_ * auVar94._8_4_;
        auVar85._12_4_ = auVar79._12_4_ * auVar94._12_4_;
        auVar85._16_4_ = auVar94._16_4_ * 0.0;
        auVar85._20_4_ = auVar94._20_4_ * 0.0;
        auVar85._24_4_ = auVar94._24_4_ * 0.0;
        auVar85._28_4_ = auVar94._28_4_;
        auVar94 = vfmsub231ps_avx512vl(auVar85,auVar95,auVar99);
        auVar86._4_4_ = auVar80._4_4_ * auVar99._4_4_;
        auVar86._0_4_ = auVar80._0_4_ * auVar99._0_4_;
        auVar86._8_4_ = auVar80._8_4_ * auVar99._8_4_;
        auVar86._12_4_ = auVar80._12_4_ * auVar99._12_4_;
        auVar86._16_4_ = auVar99._16_4_ * 0.0;
        auVar86._20_4_ = auVar99._20_4_ * 0.0;
        auVar86._24_4_ = auVar99._24_4_ * 0.0;
        auVar86._28_4_ = auVar99._28_4_;
        auVar19 = vfmsub231ps_fma(auVar86,ZEXT1632(auVar79),auVar97);
        auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar19),auVar88,auVar94);
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar88,ZEXT1632(auVar18));
        auVar98 = ZEXT1632(auVar81);
        uVar61 = vcmpps_avx512vl(auVar97,auVar98,2);
        bVar60 = (byte)uVar61;
        fVar71 = (float)((uint)(bVar60 & 1) * auVar77._0_4_ |
                        (uint)!(bool)(bVar60 & 1) * auVar20._0_4_);
        bVar12 = (bool)((byte)(uVar61 >> 1) & 1);
        fVar121 = (float)((uint)bVar12 * auVar77._4_4_ | (uint)!bVar12 * auVar20._4_4_);
        bVar12 = (bool)((byte)(uVar61 >> 2) & 1);
        fVar123 = (float)((uint)bVar12 * auVar77._8_4_ | (uint)!bVar12 * auVar20._8_4_);
        bVar12 = (bool)((byte)(uVar61 >> 3) & 1);
        fVar125 = (float)((uint)bVar12 * auVar77._12_4_ | (uint)!bVar12 * auVar20._12_4_);
        auVar93 = ZEXT1632(CONCAT412(fVar125,CONCAT48(fVar123,CONCAT44(fVar121,fVar71))));
        fVar72 = (float)((uint)(bVar60 & 1) * auVar76._0_4_ |
                        (uint)!(bool)(bVar60 & 1) * auVar21._0_4_);
        bVar12 = (bool)((byte)(uVar61 >> 1) & 1);
        fVar122 = (float)((uint)bVar12 * auVar76._4_4_ | (uint)!bVar12 * auVar21._4_4_);
        bVar12 = (bool)((byte)(uVar61 >> 2) & 1);
        fVar124 = (float)((uint)bVar12 * auVar76._8_4_ | (uint)!bVar12 * auVar21._8_4_);
        bVar12 = (bool)((byte)(uVar61 >> 3) & 1);
        fVar126 = (float)((uint)bVar12 * auVar76._12_4_ | (uint)!bVar12 * auVar21._12_4_);
        auVar84 = ZEXT1632(CONCAT412(fVar126,CONCAT48(fVar124,CONCAT44(fVar122,fVar72))));
        auVar96._0_4_ =
             (float)((uint)(bVar60 & 1) * auVar82._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar26._0_4_)
        ;
        bVar12 = (bool)((byte)(uVar61 >> 1) & 1);
        auVar96._4_4_ = (float)((uint)bVar12 * auVar82._4_4_ | (uint)!bVar12 * auVar26._4_4_);
        bVar12 = (bool)((byte)(uVar61 >> 2) & 1);
        auVar96._8_4_ = (float)((uint)bVar12 * auVar82._8_4_ | (uint)!bVar12 * auVar26._8_4_);
        bVar12 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar96._12_4_ = (float)((uint)bVar12 * auVar82._12_4_ | (uint)!bVar12 * auVar26._12_4_);
        fVar153 = (float)((uint)((byte)(uVar61 >> 4) & 1) * auVar82._16_4_);
        auVar96._16_4_ = fVar153;
        fVar140 = (float)((uint)((byte)(uVar61 >> 5) & 1) * auVar82._20_4_);
        auVar96._20_4_ = fVar140;
        fVar141 = (float)((uint)((byte)(uVar61 >> 6) & 1) * auVar82._24_4_);
        auVar96._24_4_ = fVar141;
        iVar1 = (uint)(byte)(uVar61 >> 7) * auVar82._28_4_;
        auVar96._28_4_ = iVar1;
        auVar99 = vblendmps_avx512vl(ZEXT1632(auVar79),auVar83);
        auVar103._0_4_ =
             (uint)(bVar60 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar18._0_4_;
        bVar12 = (bool)((byte)(uVar61 >> 1) & 1);
        auVar103._4_4_ = (uint)bVar12 * auVar99._4_4_ | (uint)!bVar12 * auVar18._4_4_;
        bVar12 = (bool)((byte)(uVar61 >> 2) & 1);
        auVar103._8_4_ = (uint)bVar12 * auVar99._8_4_ | (uint)!bVar12 * auVar18._8_4_;
        bVar12 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar103._12_4_ = (uint)bVar12 * auVar99._12_4_ | (uint)!bVar12 * auVar18._12_4_;
        auVar103._16_4_ = (uint)((byte)(uVar61 >> 4) & 1) * auVar99._16_4_;
        auVar103._20_4_ = (uint)((byte)(uVar61 >> 5) & 1) * auVar99._20_4_;
        auVar103._24_4_ = (uint)((byte)(uVar61 >> 6) & 1) * auVar99._24_4_;
        auVar103._28_4_ = (uint)(byte)(uVar61 >> 7) * auVar99._28_4_;
        auVar99 = vblendmps_avx512vl(ZEXT1632(auVar80),ZEXT1632(auVar78));
        auVar104._0_4_ =
             (float)((uint)(bVar60 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar76._0_4_)
        ;
        bVar12 = (bool)((byte)(uVar61 >> 1) & 1);
        auVar104._4_4_ = (float)((uint)bVar12 * auVar99._4_4_ | (uint)!bVar12 * auVar76._4_4_);
        bVar12 = (bool)((byte)(uVar61 >> 2) & 1);
        auVar104._8_4_ = (float)((uint)bVar12 * auVar99._8_4_ | (uint)!bVar12 * auVar76._8_4_);
        bVar12 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar104._12_4_ = (float)((uint)bVar12 * auVar99._12_4_ | (uint)!bVar12 * auVar76._12_4_);
        fVar175 = (float)((uint)((byte)(uVar61 >> 4) & 1) * auVar99._16_4_);
        auVar104._16_4_ = fVar175;
        fVar171 = (float)((uint)((byte)(uVar61 >> 5) & 1) * auVar99._20_4_);
        auVar104._20_4_ = fVar171;
        fVar172 = (float)((uint)((byte)(uVar61 >> 6) & 1) * auVar99._24_4_);
        auVar104._24_4_ = fVar172;
        auVar104._28_4_ = (uint)(byte)(uVar61 >> 7) * auVar99._28_4_;
        auVar99 = vblendmps_avx512vl(auVar95,ZEXT1632(auVar197));
        auVar105._0_4_ =
             (float)((uint)(bVar60 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar82._0_4_)
        ;
        bVar12 = (bool)((byte)(uVar61 >> 1) & 1);
        auVar105._4_4_ = (float)((uint)bVar12 * auVar99._4_4_ | (uint)!bVar12 * auVar82._4_4_);
        bVar12 = (bool)((byte)(uVar61 >> 2) & 1);
        auVar105._8_4_ = (float)((uint)bVar12 * auVar99._8_4_ | (uint)!bVar12 * auVar82._8_4_);
        bVar12 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar105._12_4_ = (float)((uint)bVar12 * auVar99._12_4_ | (uint)!bVar12 * auVar82._12_4_);
        bVar12 = (bool)((byte)(uVar61 >> 4) & 1);
        auVar105._16_4_ = (float)((uint)bVar12 * auVar99._16_4_ | (uint)!bVar12 * auVar82._16_4_);
        bVar12 = (bool)((byte)(uVar61 >> 5) & 1);
        auVar105._20_4_ = (float)((uint)bVar12 * auVar99._20_4_ | (uint)!bVar12 * auVar82._20_4_);
        bVar12 = (bool)((byte)(uVar61 >> 6) & 1);
        auVar105._24_4_ = (float)((uint)bVar12 * auVar99._24_4_ | (uint)!bVar12 * auVar82._24_4_);
        bVar12 = SUB81(uVar61 >> 7,0);
        auVar105._28_4_ = (uint)bVar12 * auVar99._28_4_ | (uint)!bVar12 * auVar82._28_4_;
        auVar106._0_4_ =
             (uint)(bVar60 & 1) * (int)auVar79._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar83._0_4_;
        bVar12 = (bool)((byte)(uVar61 >> 1) & 1);
        auVar106._4_4_ = (uint)bVar12 * (int)auVar79._4_4_ | (uint)!bVar12 * auVar83._4_4_;
        bVar12 = (bool)((byte)(uVar61 >> 2) & 1);
        auVar106._8_4_ = (uint)bVar12 * (int)auVar79._8_4_ | (uint)!bVar12 * auVar83._8_4_;
        bVar12 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar106._12_4_ = (uint)bVar12 * (int)auVar79._12_4_ | (uint)!bVar12 * auVar83._12_4_;
        auVar106._16_4_ = (uint)!(bool)((byte)(uVar61 >> 4) & 1) * auVar83._16_4_;
        auVar106._20_4_ = (uint)!(bool)((byte)(uVar61 >> 5) & 1) * auVar83._20_4_;
        auVar106._24_4_ = (uint)!(bool)((byte)(uVar61 >> 6) & 1) * auVar83._24_4_;
        auVar106._28_4_ = (uint)!SUB81(uVar61 >> 7,0) * auVar83._28_4_;
        bVar12 = (bool)((byte)(uVar61 >> 1) & 1);
        bVar14 = (bool)((byte)(uVar61 >> 2) & 1);
        bVar15 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar107._0_4_ =
             (uint)(bVar60 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar197._0_4_;
        bVar13 = (bool)((byte)(uVar61 >> 1) & 1);
        auVar107._4_4_ = (uint)bVar13 * auVar95._4_4_ | (uint)!bVar13 * auVar197._4_4_;
        bVar13 = (bool)((byte)(uVar61 >> 2) & 1);
        auVar107._8_4_ = (uint)bVar13 * auVar95._8_4_ | (uint)!bVar13 * auVar197._8_4_;
        bVar13 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar107._12_4_ = (uint)bVar13 * auVar95._12_4_ | (uint)!bVar13 * auVar197._12_4_;
        auVar107._16_4_ = (uint)((byte)(uVar61 >> 4) & 1) * auVar95._16_4_;
        auVar107._20_4_ = (uint)((byte)(uVar61 >> 5) & 1) * auVar95._20_4_;
        auVar107._24_4_ = (uint)((byte)(uVar61 >> 6) & 1) * auVar95._24_4_;
        iVar2 = (uint)(byte)(uVar61 >> 7) * auVar95._28_4_;
        auVar107._28_4_ = iVar2;
        auVar85 = vsubps_avx512vl(auVar106,auVar93);
        auVar99 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar15 * (int)auVar80._12_4_ |
                                                (uint)!bVar15 * auVar78._12_4_,
                                                CONCAT48((uint)bVar14 * (int)auVar80._8_4_ |
                                                         (uint)!bVar14 * auVar78._8_4_,
                                                         CONCAT44((uint)bVar12 * (int)auVar80._4_4_
                                                                  | (uint)!bVar12 * auVar78._4_4_,
                                                                  (uint)(bVar60 & 1) *
                                                                  (int)auVar80._0_4_ |
                                                                  (uint)!(bool)(bVar60 & 1) *
                                                                  auVar78._0_4_)))),auVar84);
        auVar95 = vsubps_avx(auVar107,auVar96);
        auVar94 = vsubps_avx(auVar93,auVar103);
        auVar82 = vsubps_avx(auVar84,auVar104);
        auVar83 = vsubps_avx(auVar96,auVar105);
        auVar88._4_4_ = auVar95._4_4_ * fVar121;
        auVar88._0_4_ = auVar95._0_4_ * fVar71;
        auVar88._8_4_ = auVar95._8_4_ * fVar123;
        auVar88._12_4_ = auVar95._12_4_ * fVar125;
        auVar88._16_4_ = auVar95._16_4_ * 0.0;
        auVar88._20_4_ = auVar95._20_4_ * 0.0;
        auVar88._24_4_ = auVar95._24_4_ * 0.0;
        auVar88._28_4_ = iVar2;
        auVar77 = vfmsub231ps_fma(auVar88,auVar96,auVar85);
        auVar89._4_4_ = fVar122 * auVar85._4_4_;
        auVar89._0_4_ = fVar72 * auVar85._0_4_;
        auVar89._8_4_ = fVar124 * auVar85._8_4_;
        auVar89._12_4_ = fVar126 * auVar85._12_4_;
        auVar89._16_4_ = auVar85._16_4_ * 0.0;
        auVar89._20_4_ = auVar85._20_4_ * 0.0;
        auVar89._24_4_ = auVar85._24_4_ * 0.0;
        auVar89._28_4_ = auVar97._28_4_;
        auVar76 = vfmsub231ps_fma(auVar89,auVar93,auVar99);
        auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar76),auVar98,ZEXT1632(auVar77));
        auVar162._0_4_ = auVar99._0_4_ * auVar96._0_4_;
        auVar162._4_4_ = auVar99._4_4_ * auVar96._4_4_;
        auVar162._8_4_ = auVar99._8_4_ * auVar96._8_4_;
        auVar162._12_4_ = auVar99._12_4_ * auVar96._12_4_;
        auVar162._16_4_ = auVar99._16_4_ * fVar153;
        auVar162._20_4_ = auVar99._20_4_ * fVar140;
        auVar162._24_4_ = auVar99._24_4_ * fVar141;
        auVar162._28_4_ = 0;
        auVar77 = vfmsub231ps_fma(auVar162,auVar84,auVar95);
        auVar86 = vfmadd231ps_avx512vl(auVar97,auVar98,ZEXT1632(auVar77));
        auVar97 = vmulps_avx512vl(auVar83,auVar103);
        auVar97 = vfmsub231ps_avx512vl(auVar97,auVar94,auVar105);
        auVar92._4_4_ = auVar82._4_4_ * auVar105._4_4_;
        auVar92._0_4_ = auVar82._0_4_ * auVar105._0_4_;
        auVar92._8_4_ = auVar82._8_4_ * auVar105._8_4_;
        auVar92._12_4_ = auVar82._12_4_ * auVar105._12_4_;
        auVar92._16_4_ = auVar82._16_4_ * auVar105._16_4_;
        auVar92._20_4_ = auVar82._20_4_ * auVar105._20_4_;
        auVar92._24_4_ = auVar82._24_4_ * auVar105._24_4_;
        auVar92._28_4_ = auVar105._28_4_;
        auVar77 = vfmsub231ps_fma(auVar92,auVar104,auVar83);
        auVar163._0_4_ = auVar104._0_4_ * auVar94._0_4_;
        auVar163._4_4_ = auVar104._4_4_ * auVar94._4_4_;
        auVar163._8_4_ = auVar104._8_4_ * auVar94._8_4_;
        auVar163._12_4_ = auVar104._12_4_ * auVar94._12_4_;
        auVar163._16_4_ = fVar175 * auVar94._16_4_;
        auVar163._20_4_ = fVar171 * auVar94._20_4_;
        auVar163._24_4_ = fVar172 * auVar94._24_4_;
        auVar163._28_4_ = 0;
        auVar76 = vfmsub231ps_fma(auVar163,auVar82,auVar103);
        auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar76),auVar98,auVar97);
        auVar88 = vfmadd231ps_avx512vl(auVar97,auVar98,ZEXT1632(auVar77));
        auVar97 = vmaxps_avx(auVar86,auVar88);
        uVar142 = vcmpps_avx512vl(auVar97,auVar98,2);
        bVar70 = bVar70 & (byte)uVar142;
        auVar199 = ZEXT3264(local_760);
        auVar200 = ZEXT3264(local_780);
        auVar195 = ZEXT3264(local_8c0);
        auVar194 = ZEXT3264(local_8e0);
        if (bVar70 == 0) {
          uVar64 = 0;
          auVar97 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar196 = ZEXT3264(auVar97);
          auVar203 = ZEXT3264(local_800);
          auVar201 = ZEXT3264(local_820);
          auVar139 = ZEXT3264(local_840);
          auVar202 = ZEXT3264(local_860);
        }
        else {
          auVar89 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x200)));
          auVar193 = ZEXT3264(auVar89);
          auVar35._4_4_ = auVar83._4_4_ * auVar99._4_4_;
          auVar35._0_4_ = auVar83._0_4_ * auVar99._0_4_;
          auVar35._8_4_ = auVar83._8_4_ * auVar99._8_4_;
          auVar35._12_4_ = auVar83._12_4_ * auVar99._12_4_;
          auVar35._16_4_ = auVar83._16_4_ * auVar99._16_4_;
          auVar35._20_4_ = auVar83._20_4_ * auVar99._20_4_;
          auVar35._24_4_ = auVar83._24_4_ * auVar99._24_4_;
          auVar35._28_4_ = auVar97._28_4_;
          auVar78 = vfmsub231ps_fma(auVar35,auVar82,auVar95);
          auVar36._4_4_ = auVar95._4_4_ * auVar94._4_4_;
          auVar36._0_4_ = auVar95._0_4_ * auVar94._0_4_;
          auVar36._8_4_ = auVar95._8_4_ * auVar94._8_4_;
          auVar36._12_4_ = auVar95._12_4_ * auVar94._12_4_;
          auVar36._16_4_ = auVar95._16_4_ * auVar94._16_4_;
          auVar36._20_4_ = auVar95._20_4_ * auVar94._20_4_;
          auVar36._24_4_ = auVar95._24_4_ * auVar94._24_4_;
          auVar36._28_4_ = auVar95._28_4_;
          auVar76 = vfmsub231ps_fma(auVar36,auVar85,auVar83);
          auVar37._4_4_ = auVar82._4_4_ * auVar85._4_4_;
          auVar37._0_4_ = auVar82._0_4_ * auVar85._0_4_;
          auVar37._8_4_ = auVar82._8_4_ * auVar85._8_4_;
          auVar37._12_4_ = auVar82._12_4_ * auVar85._12_4_;
          auVar37._16_4_ = auVar82._16_4_ * auVar85._16_4_;
          auVar37._20_4_ = auVar82._20_4_ * auVar85._20_4_;
          auVar37._24_4_ = auVar82._24_4_ * auVar85._24_4_;
          auVar37._28_4_ = auVar82._28_4_;
          auVar197 = vfmsub231ps_fma(auVar37,auVar94,auVar99);
          auVar77 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar76),ZEXT1632(auVar197));
          auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar77),ZEXT1632(auVar78),auVar98);
          auVar99 = vrcp14ps_avx512vl(auVar97);
          auVar95 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar196 = ZEXT3264(auVar95);
          auVar94 = vfnmadd213ps_avx512vl(auVar99,auVar97,auVar95);
          auVar77 = vfmadd132ps_fma(auVar94,auVar99,auVar99);
          auVar38._4_4_ = auVar197._4_4_ * auVar96._4_4_;
          auVar38._0_4_ = auVar197._0_4_ * auVar96._0_4_;
          auVar38._8_4_ = auVar197._8_4_ * auVar96._8_4_;
          auVar38._12_4_ = auVar197._12_4_ * auVar96._12_4_;
          auVar38._16_4_ = fVar153 * 0.0;
          auVar38._20_4_ = fVar140 * 0.0;
          auVar38._24_4_ = fVar141 * 0.0;
          auVar38._28_4_ = iVar1;
          auVar76 = vfmadd231ps_fma(auVar38,auVar84,ZEXT1632(auVar76));
          auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar93,ZEXT1632(auVar78));
          fVar153 = auVar77._0_4_;
          fVar140 = auVar77._4_4_;
          fVar141 = auVar77._8_4_;
          fVar172 = auVar77._12_4_;
          local_600 = ZEXT1632(CONCAT412(auVar76._12_4_ * fVar172,
                                         CONCAT48(auVar76._8_4_ * fVar141,
                                                  CONCAT44(auVar76._4_4_ * fVar140,
                                                           auVar76._0_4_ * fVar153))));
          auVar178._4_4_ = uVar67;
          auVar178._0_4_ = uVar67;
          auVar178._8_4_ = uVar67;
          auVar178._12_4_ = uVar67;
          auVar178._16_4_ = uVar67;
          auVar178._20_4_ = uVar67;
          auVar178._24_4_ = uVar67;
          auVar178._28_4_ = uVar67;
          uVar142 = vcmpps_avx512vl(local_600,auVar89,2);
          uVar23 = vcmpps_avx512vl(auVar178,local_600,2);
          bVar70 = (byte)uVar142 & (byte)uVar23 & bVar70;
          auVar203 = ZEXT3264(local_800);
          auVar201 = ZEXT3264(local_820);
          auVar139 = ZEXT3264(local_840);
          auVar202 = ZEXT3264(local_860);
          auVar192 = ZEXT3264(auVar87);
          if (bVar70 != 0) {
            uVar142 = vcmpps_avx512vl(auVar97,auVar98,4);
            bVar70 = bVar70 & (byte)uVar142;
            if (bVar70 != 0) {
              fVar171 = auVar86._0_4_ * fVar153;
              fVar175 = auVar86._4_4_ * fVar140;
              auVar39._4_4_ = fVar175;
              auVar39._0_4_ = fVar171;
              fVar71 = auVar86._8_4_ * fVar141;
              auVar39._8_4_ = fVar71;
              fVar72 = auVar86._12_4_ * fVar172;
              auVar39._12_4_ = fVar72;
              fVar121 = auVar86._16_4_ * 0.0;
              auVar39._16_4_ = fVar121;
              fVar122 = auVar86._20_4_ * 0.0;
              auVar39._20_4_ = fVar122;
              fVar123 = auVar86._24_4_ * 0.0;
              auVar39._24_4_ = fVar123;
              auVar39._28_4_ = auVar97._28_4_;
              auVar99 = vsubps_avx512vl(auVar95,auVar39);
              local_640._0_4_ =
                   (float)((uint)(bVar60 & 1) * (int)fVar171 |
                          (uint)!(bool)(bVar60 & 1) * auVar99._0_4_);
              bVar12 = (bool)((byte)(uVar61 >> 1) & 1);
              local_640._4_4_ = (float)((uint)bVar12 * (int)fVar175 | (uint)!bVar12 * auVar99._4_4_)
              ;
              bVar12 = (bool)((byte)(uVar61 >> 2) & 1);
              local_640._8_4_ = (float)((uint)bVar12 * (int)fVar71 | (uint)!bVar12 * auVar99._8_4_);
              bVar12 = (bool)((byte)(uVar61 >> 3) & 1);
              local_640._12_4_ =
                   (float)((uint)bVar12 * (int)fVar72 | (uint)!bVar12 * auVar99._12_4_);
              bVar12 = (bool)((byte)(uVar61 >> 4) & 1);
              local_640._16_4_ =
                   (float)((uint)bVar12 * (int)fVar121 | (uint)!bVar12 * auVar99._16_4_);
              bVar12 = (bool)((byte)(uVar61 >> 5) & 1);
              local_640._20_4_ =
                   (float)((uint)bVar12 * (int)fVar122 | (uint)!bVar12 * auVar99._20_4_);
              bVar12 = (bool)((byte)(uVar61 >> 6) & 1);
              local_640._24_4_ =
                   (float)((uint)bVar12 * (int)fVar123 | (uint)!bVar12 * auVar99._24_4_);
              bVar12 = SUB81(uVar61 >> 7,0);
              local_640._28_4_ =
                   (float)((uint)bVar12 * auVar97._28_4_ | (uint)!bVar12 * auVar99._28_4_);
              auVar97 = vsubps_avx(ZEXT1632(auVar22),auVar90);
              auVar77 = vfmadd213ps_fma(auVar97,local_640,auVar90);
              uVar130 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
              auVar90._4_4_ = uVar130;
              auVar90._0_4_ = uVar130;
              auVar90._8_4_ = uVar130;
              auVar90._12_4_ = uVar130;
              auVar90._16_4_ = uVar130;
              auVar90._20_4_ = uVar130;
              auVar90._24_4_ = uVar130;
              auVar90._28_4_ = uVar130;
              auVar97 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar77._12_4_ + auVar77._12_4_,
                                                           CONCAT48(auVar77._8_4_ + auVar77._8_4_,
                                                                    CONCAT44(auVar77._4_4_ +
                                                                             auVar77._4_4_,
                                                                             auVar77._0_4_ +
                                                                             auVar77._0_4_)))),
                                        auVar90);
              uVar142 = vcmpps_avx512vl(local_600,auVar97,6);
              if (((byte)uVar142 & bVar70) != 0) {
                auVar156._0_4_ = auVar88._0_4_ * fVar153;
                auVar156._4_4_ = auVar88._4_4_ * fVar140;
                auVar156._8_4_ = auVar88._8_4_ * fVar141;
                auVar156._12_4_ = auVar88._12_4_ * fVar172;
                auVar156._16_4_ = auVar88._16_4_ * 0.0;
                auVar156._20_4_ = auVar88._20_4_ * 0.0;
                auVar156._24_4_ = auVar88._24_4_ * 0.0;
                auVar156._28_4_ = 0;
                auVar97 = vsubps_avx512vl(auVar95,auVar156);
                auVar108._0_4_ =
                     (uint)(bVar60 & 1) * (int)auVar156._0_4_ |
                     (uint)!(bool)(bVar60 & 1) * auVar97._0_4_;
                bVar12 = (bool)((byte)(uVar61 >> 1) & 1);
                auVar108._4_4_ = (uint)bVar12 * (int)auVar156._4_4_ | (uint)!bVar12 * auVar97._4_4_;
                bVar12 = (bool)((byte)(uVar61 >> 2) & 1);
                auVar108._8_4_ = (uint)bVar12 * (int)auVar156._8_4_ | (uint)!bVar12 * auVar97._8_4_;
                bVar12 = (bool)((byte)(uVar61 >> 3) & 1);
                auVar108._12_4_ =
                     (uint)bVar12 * (int)auVar156._12_4_ | (uint)!bVar12 * auVar97._12_4_;
                bVar12 = (bool)((byte)(uVar61 >> 4) & 1);
                auVar108._16_4_ =
                     (uint)bVar12 * (int)auVar156._16_4_ | (uint)!bVar12 * auVar97._16_4_;
                bVar12 = (bool)((byte)(uVar61 >> 5) & 1);
                auVar108._20_4_ =
                     (uint)bVar12 * (int)auVar156._20_4_ | (uint)!bVar12 * auVar97._20_4_;
                bVar12 = (bool)((byte)(uVar61 >> 6) & 1);
                auVar108._24_4_ =
                     (uint)bVar12 * (int)auVar156._24_4_ | (uint)!bVar12 * auVar97._24_4_;
                auVar108._28_4_ = (uint)!SUB81(uVar61 >> 7,0) * auVar97._28_4_;
                auVar32._8_4_ = 0x40000000;
                auVar32._0_8_ = 0x4000000040000000;
                auVar32._12_4_ = 0x40000000;
                auVar32._16_4_ = 0x40000000;
                auVar32._20_4_ = 0x40000000;
                auVar32._24_4_ = 0x40000000;
                auVar32._28_4_ = 0x40000000;
                local_620 = vfmsub132ps_avx512vl(auVar108,auVar95,auVar32);
                local_5e0 = 0;
                local_5d0 = local_870._0_8_;
                uStack_5c8 = local_870._8_8_;
                local_5c0 = local_880._0_8_;
                uStack_5b8 = local_880._8_8_;
                local_5b0 = local_890._0_8_;
                uStack_5a8 = local_890._8_8_;
                if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (uVar64 = CONCAT71((int7)(uVar64 >> 8),1),
                     pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    fVar153 = 1.0 / auVar91._0_4_;
                    local_580[0] = fVar153 * (local_640._0_4_ + 0.0);
                    local_580[1] = fVar153 * (local_640._4_4_ + 1.0);
                    local_580[2] = fVar153 * (local_640._8_4_ + 2.0);
                    local_580[3] = fVar153 * (local_640._12_4_ + 3.0);
                    fStack_570 = fVar153 * (local_640._16_4_ + 4.0);
                    fStack_56c = fVar153 * (local_640._20_4_ + 5.0);
                    fStack_568 = fVar153 * (local_640._24_4_ + 6.0);
                    fStack_564 = local_640._28_4_ + 7.0;
                    local_560 = local_620;
                    local_540 = local_600;
                    uVar61 = 0;
                    uVar65 = (ulong)((byte)uVar142 & bVar70);
                    for (uVar66 = uVar65; (uVar66 & 1) == 0;
                        uVar66 = uVar66 >> 1 | 0x8000000000000000) {
                      uVar61 = uVar61 + 1;
                    }
                    auVar196 = vpbroadcastd_avx512f();
                    _local_440 = vmovdqa64_avx512f(auVar196);
                    auVar196 = vpbroadcastd_avx512f();
                    local_480 = vmovdqa64_avx512f(auVar196);
                    local_7a0 = auVar87;
                    local_740 = auVar89;
                    local_5dc = iVar8;
                    do {
                      auVar197 = auVar198._0_16_;
                      local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_580[uVar61]));
                      local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_560 + uVar61 * 4)));
                      *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_540 + uVar61 * 4)
                      ;
                      local_910.context = context->user;
                      fVar172 = local_200._0_4_;
                      fVar153 = 1.0 - fVar172;
                      auVar29._8_4_ = 0x80000000;
                      auVar29._0_8_ = 0x8000000080000000;
                      auVar29._12_4_ = 0x80000000;
                      auVar78 = vxorps_avx512vl(ZEXT416((uint)fVar153),auVar29);
                      auVar77 = ZEXT416((uint)(fVar172 * fVar153 * 4.0));
                      auVar76 = vfnmsub213ss_fma(local_200._0_16_,local_200._0_16_,auVar77);
                      auVar77 = vfmadd213ss_fma(ZEXT416((uint)fVar153),ZEXT416((uint)fVar153),
                                                auVar77);
                      fVar153 = fVar153 * auVar78._0_4_ * 0.5;
                      fVar140 = auVar76._0_4_ * 0.5;
                      fVar141 = auVar77._0_4_ * 0.5;
                      fVar172 = fVar172 * fVar172 * 0.5;
                      auVar169._0_4_ = fVar172 * (float)local_710._0_4_;
                      auVar169._4_4_ = fVar172 * (float)local_710._4_4_;
                      auVar169._8_4_ = fVar172 * fStack_708;
                      auVar169._12_4_ = fVar172 * fStack_704;
                      auVar135._4_4_ = fVar141;
                      auVar135._0_4_ = fVar141;
                      auVar135._8_4_ = fVar141;
                      auVar135._12_4_ = fVar141;
                      auVar77 = vfmadd132ps_fma(auVar135,auVar169,local_890);
                      auVar160._4_4_ = fVar140;
                      auVar160._0_4_ = fVar140;
                      auVar160._8_4_ = fVar140;
                      auVar160._12_4_ = fVar140;
                      auVar77 = vfmadd132ps_fma(auVar160,auVar77,local_880);
                      auVar136._4_4_ = fVar153;
                      auVar136._0_4_ = fVar153;
                      auVar136._8_4_ = fVar153;
                      auVar136._12_4_ = fVar153;
                      auVar77 = vfmadd132ps_fma(auVar136,auVar77,local_870);
                      auVar196 = vbroadcastss_avx512f(auVar77);
                      auVar119 = vbroadcastss_avx512f(ZEXT416(1));
                      local_280 = vpermps_avx512f(auVar119,ZEXT1664(auVar77));
                      auVar119 = vbroadcastss_avx512f(ZEXT416(2));
                      local_240 = vpermps_avx512f(auVar119,ZEXT1664(auVar77));
                      local_2c0[0] = (RTCHitN)auVar196[0];
                      local_2c0[1] = (RTCHitN)auVar196[1];
                      local_2c0[2] = (RTCHitN)auVar196[2];
                      local_2c0[3] = (RTCHitN)auVar196[3];
                      local_2c0[4] = (RTCHitN)auVar196[4];
                      local_2c0[5] = (RTCHitN)auVar196[5];
                      local_2c0[6] = (RTCHitN)auVar196[6];
                      local_2c0[7] = (RTCHitN)auVar196[7];
                      local_2c0[8] = (RTCHitN)auVar196[8];
                      local_2c0[9] = (RTCHitN)auVar196[9];
                      local_2c0[10] = (RTCHitN)auVar196[10];
                      local_2c0[0xb] = (RTCHitN)auVar196[0xb];
                      local_2c0[0xc] = (RTCHitN)auVar196[0xc];
                      local_2c0[0xd] = (RTCHitN)auVar196[0xd];
                      local_2c0[0xe] = (RTCHitN)auVar196[0xe];
                      local_2c0[0xf] = (RTCHitN)auVar196[0xf];
                      local_2c0[0x10] = (RTCHitN)auVar196[0x10];
                      local_2c0[0x11] = (RTCHitN)auVar196[0x11];
                      local_2c0[0x12] = (RTCHitN)auVar196[0x12];
                      local_2c0[0x13] = (RTCHitN)auVar196[0x13];
                      local_2c0[0x14] = (RTCHitN)auVar196[0x14];
                      local_2c0[0x15] = (RTCHitN)auVar196[0x15];
                      local_2c0[0x16] = (RTCHitN)auVar196[0x16];
                      local_2c0[0x17] = (RTCHitN)auVar196[0x17];
                      local_2c0[0x18] = (RTCHitN)auVar196[0x18];
                      local_2c0[0x19] = (RTCHitN)auVar196[0x19];
                      local_2c0[0x1a] = (RTCHitN)auVar196[0x1a];
                      local_2c0[0x1b] = (RTCHitN)auVar196[0x1b];
                      local_2c0[0x1c] = (RTCHitN)auVar196[0x1c];
                      local_2c0[0x1d] = (RTCHitN)auVar196[0x1d];
                      local_2c0[0x1e] = (RTCHitN)auVar196[0x1e];
                      local_2c0[0x1f] = (RTCHitN)auVar196[0x1f];
                      local_2c0[0x20] = (RTCHitN)auVar196[0x20];
                      local_2c0[0x21] = (RTCHitN)auVar196[0x21];
                      local_2c0[0x22] = (RTCHitN)auVar196[0x22];
                      local_2c0[0x23] = (RTCHitN)auVar196[0x23];
                      local_2c0[0x24] = (RTCHitN)auVar196[0x24];
                      local_2c0[0x25] = (RTCHitN)auVar196[0x25];
                      local_2c0[0x26] = (RTCHitN)auVar196[0x26];
                      local_2c0[0x27] = (RTCHitN)auVar196[0x27];
                      local_2c0[0x28] = (RTCHitN)auVar196[0x28];
                      local_2c0[0x29] = (RTCHitN)auVar196[0x29];
                      local_2c0[0x2a] = (RTCHitN)auVar196[0x2a];
                      local_2c0[0x2b] = (RTCHitN)auVar196[0x2b];
                      local_2c0[0x2c] = (RTCHitN)auVar196[0x2c];
                      local_2c0[0x2d] = (RTCHitN)auVar196[0x2d];
                      local_2c0[0x2e] = (RTCHitN)auVar196[0x2e];
                      local_2c0[0x2f] = (RTCHitN)auVar196[0x2f];
                      local_2c0[0x30] = (RTCHitN)auVar196[0x30];
                      local_2c0[0x31] = (RTCHitN)auVar196[0x31];
                      local_2c0[0x32] = (RTCHitN)auVar196[0x32];
                      local_2c0[0x33] = (RTCHitN)auVar196[0x33];
                      local_2c0[0x34] = (RTCHitN)auVar196[0x34];
                      local_2c0[0x35] = (RTCHitN)auVar196[0x35];
                      local_2c0[0x36] = (RTCHitN)auVar196[0x36];
                      local_2c0[0x37] = (RTCHitN)auVar196[0x37];
                      local_2c0[0x38] = (RTCHitN)auVar196[0x38];
                      local_2c0[0x39] = (RTCHitN)auVar196[0x39];
                      local_2c0[0x3a] = (RTCHitN)auVar196[0x3a];
                      local_2c0[0x3b] = (RTCHitN)auVar196[0x3b];
                      local_2c0[0x3c] = (RTCHitN)auVar196[0x3c];
                      local_2c0[0x3d] = (RTCHitN)auVar196[0x3d];
                      local_2c0[0x3e] = (RTCHitN)auVar196[0x3e];
                      local_2c0[0x3f] = (RTCHitN)auVar196[0x3f];
                      local_180 = local_480._0_8_;
                      uStack_178 = local_480._8_8_;
                      uStack_170 = local_480._16_8_;
                      uStack_168 = local_480._24_8_;
                      uStack_160 = local_480._32_8_;
                      uStack_158 = local_480._40_8_;
                      uStack_150 = local_480._48_8_;
                      uStack_148 = local_480._56_8_;
                      auVar196 = vmovdqa64_avx512f(_local_440);
                      local_140 = vmovdqa64_avx512f(auVar196);
                      vpcmpeqd_avx2(auVar196._0_32_,auVar196._0_32_);
                      local_100 = vbroadcastss_avx512f(ZEXT416((local_910.context)->instID[0]));
                      local_c0 = vbroadcastss_avx512f(ZEXT416((local_910.context)->instPrimID[0]));
                      auVar119 = vmovdqa64_avx512f(local_300);
                      local_6c0 = vmovdqa64_avx512f(auVar119);
                      local_910.valid = (int *)local_6c0;
                      local_910.geometryUserPtr = pGVar9->userPtr;
                      local_910.hit = local_2c0;
                      local_910.N = 0x10;
                      local_6e0 = (float)uVar65;
                      fStack_6dc = (float)(uVar65 >> 0x20);
                      local_700 = (uint)uVar61;
                      uStack_6fc = (uint)(uVar61 >> 0x20);
                      local_910.ray = (RTCRayN *)ray;
                      if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar9->occlusionFilterN)(&local_910);
                        uVar61 = CONCAT44(uStack_6fc,local_700);
                        uVar65 = CONCAT44(fStack_6dc,local_6e0);
                        auVar193 = ZEXT3264(local_740);
                        auVar192 = ZEXT3264(local_7a0);
                        auVar202 = ZEXT3264(local_860);
                        auVar139 = ZEXT3264(local_840);
                        auVar201 = ZEXT3264(local_820);
                        auVar203 = ZEXT3264(local_800);
                        auVar194 = ZEXT3264(local_8e0);
                        auVar195 = ZEXT3264(local_8c0);
                        auVar200 = ZEXT3264(local_780);
                        auVar199 = ZEXT3264(local_760);
                        auVar77 = vxorps_avx512vl(auVar197,auVar197);
                        auVar198 = ZEXT1664(auVar77);
                        auVar119 = vmovdqa64_avx512f(local_6c0);
                        uVar67 = local_7c0._0_4_;
                      }
                      auVar77 = auVar198._0_16_;
                      uVar142 = vptestmd_avx512f(auVar119,auVar119);
                      if ((short)uVar142 == 0) {
                        auVar97 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar196 = ZEXT3264(auVar97);
                      }
                      else {
                        p_Var11 = context->args->filter;
                        if (p_Var11 == (RTCFilterFunctionN)0x0) {
                          auVar97 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar196 = ZEXT3264(auVar97);
                        }
                        else {
                          auVar97 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar196 = ZEXT3264(auVar97);
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar9->field_8).field_0x2 & 0x40) != 0)) {
                            (*p_Var11)(&local_910);
                            uVar61 = CONCAT44(uStack_6fc,local_700);
                            uVar65 = CONCAT44(fStack_6dc,local_6e0);
                            auVar193 = ZEXT3264(local_740);
                            auVar192 = ZEXT3264(local_7a0);
                            auVar202 = ZEXT3264(local_860);
                            auVar139 = ZEXT3264(local_840);
                            auVar201 = ZEXT3264(local_820);
                            auVar203 = ZEXT3264(local_800);
                            auVar194 = ZEXT3264(local_8e0);
                            auVar195 = ZEXT3264(local_8c0);
                            auVar200 = ZEXT3264(local_780);
                            auVar199 = ZEXT3264(local_760);
                            auVar77 = vxorps_avx512vl(auVar77,auVar77);
                            auVar198 = ZEXT1664(auVar77);
                            auVar97 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                            auVar196 = ZEXT3264(auVar97);
                            auVar119 = vmovdqa64_avx512f(local_6c0);
                            uVar67 = local_7c0._0_4_;
                          }
                        }
                        auVar87 = auVar192._0_32_;
                        uVar66 = vptestmd_avx512f(auVar119,auVar119);
                        auVar119 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                        bVar12 = (bool)((byte)uVar66 & 1);
                        auVar120._0_4_ =
                             (uint)bVar12 * auVar119._0_4_ |
                             (uint)!bVar12 * *(int *)(local_910.ray + 0x200);
                        bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
                        auVar120._4_4_ =
                             (uint)bVar12 * auVar119._4_4_ |
                             (uint)!bVar12 * *(int *)(local_910.ray + 0x204);
                        bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
                        auVar120._8_4_ =
                             (uint)bVar12 * auVar119._8_4_ |
                             (uint)!bVar12 * *(int *)(local_910.ray + 0x208);
                        bVar12 = (bool)((byte)(uVar66 >> 3) & 1);
                        auVar120._12_4_ =
                             (uint)bVar12 * auVar119._12_4_ |
                             (uint)!bVar12 * *(int *)(local_910.ray + 0x20c);
                        bVar12 = (bool)((byte)(uVar66 >> 4) & 1);
                        auVar120._16_4_ =
                             (uint)bVar12 * auVar119._16_4_ |
                             (uint)!bVar12 * *(int *)(local_910.ray + 0x210);
                        bVar12 = (bool)((byte)(uVar66 >> 5) & 1);
                        auVar120._20_4_ =
                             (uint)bVar12 * auVar119._20_4_ |
                             (uint)!bVar12 * *(int *)(local_910.ray + 0x214);
                        bVar12 = (bool)((byte)(uVar66 >> 6) & 1);
                        auVar120._24_4_ =
                             (uint)bVar12 * auVar119._24_4_ |
                             (uint)!bVar12 * *(int *)(local_910.ray + 0x218);
                        bVar12 = (bool)((byte)(uVar66 >> 7) & 1);
                        auVar120._28_4_ =
                             (uint)bVar12 * auVar119._28_4_ |
                             (uint)!bVar12 * *(int *)(local_910.ray + 0x21c);
                        bVar12 = (bool)((byte)(uVar66 >> 8) & 1);
                        auVar120._32_4_ =
                             (uint)bVar12 * auVar119._32_4_ |
                             (uint)!bVar12 * *(int *)(local_910.ray + 0x220);
                        bVar12 = (bool)((byte)(uVar66 >> 9) & 1);
                        auVar120._36_4_ =
                             (uint)bVar12 * auVar119._36_4_ |
                             (uint)!bVar12 * *(int *)(local_910.ray + 0x224);
                        bVar12 = (bool)((byte)(uVar66 >> 10) & 1);
                        auVar120._40_4_ =
                             (uint)bVar12 * auVar119._40_4_ |
                             (uint)!bVar12 * *(int *)(local_910.ray + 0x228);
                        bVar12 = (bool)((byte)(uVar66 >> 0xb) & 1);
                        auVar120._44_4_ =
                             (uint)bVar12 * auVar119._44_4_ |
                             (uint)!bVar12 * *(int *)(local_910.ray + 0x22c);
                        bVar12 = (bool)((byte)(uVar66 >> 0xc) & 1);
                        auVar120._48_4_ =
                             (uint)bVar12 * auVar119._48_4_ |
                             (uint)!bVar12 * *(int *)(local_910.ray + 0x230);
                        bVar12 = (bool)((byte)(uVar66 >> 0xd) & 1);
                        auVar120._52_4_ =
                             (uint)bVar12 * auVar119._52_4_ |
                             (uint)!bVar12 * *(int *)(local_910.ray + 0x234);
                        bVar12 = (bool)((byte)(uVar66 >> 0xe) & 1);
                        auVar120._56_4_ =
                             (uint)bVar12 * auVar119._56_4_ |
                             (uint)!bVar12 * *(int *)(local_910.ray + 0x238);
                        bVar12 = SUB81(uVar66 >> 0xf,0);
                        auVar120._60_4_ =
                             (uint)bVar12 * auVar119._60_4_ |
                             (uint)!bVar12 * *(int *)(local_910.ray + 0x23c);
                        *(undefined1 (*) [64])(local_910.ray + 0x200) = auVar120;
                        if ((short)uVar66 != 0) {
                          uVar64 = CONCAT71((int7)(uVar64 >> 8),1);
                          break;
                        }
                      }
                      auVar87 = auVar192._0_32_;
                      *(int *)(ray + k * 4 + 0x200) = auVar193._0_4_;
                      uVar66 = uVar61 & 0x3f;
                      uVar64 = 0;
                      uVar61 = 0;
                      uVar65 = uVar65 ^ 1L << uVar66;
                      for (uVar66 = uVar65; (uVar66 & 1) == 0;
                          uVar66 = uVar66 >> 1 | 0x8000000000000000) {
                        uVar61 = uVar61 + 1;
                      }
                    } while (uVar65 != 0);
                  }
                  goto LAB_01bbeb35;
                }
              }
            }
          }
          uVar64 = 0;
        }
      }
LAB_01bbeb35:
      auVar192 = _local_440;
      if (8 < iVar8) {
        local_7c0 = vpbroadcastd_avx512vl();
        local_440._4_4_ = 1.0 / (float)local_500._0_4_;
        local_440._0_4_ = local_440._4_4_;
        fStack_438 = (float)local_440._4_4_;
        fStack_434 = (float)local_440._4_4_;
        fStack_430 = (float)local_440._4_4_;
        fStack_42c = (float)local_440._4_4_;
        fStack_428 = (float)local_440._4_4_;
        auStack_420 = auVar192._32_32_;
        fStack_424 = (float)local_440._4_4_;
        auVar192 = vpbroadcastd_avx512f();
        local_500 = vmovdqa64_avx512f(auVar192);
        auVar192 = vpbroadcastd_avx512f();
        local_4c0 = vmovdqa64_avx512f(auVar192);
        lVar68 = 8;
        local_7a0 = auVar87;
        local_700 = uVar67;
        uStack_6fc = uVar67;
        uStack_6f8 = uVar67;
        uStack_6f4 = uVar67;
        uStack_6f0 = uVar67;
        uStack_6ec = uVar67;
        uStack_6e8 = uVar67;
        uStack_6e4 = uVar67;
        local_6e0 = fVar129;
        fStack_6dc = fVar129;
        fStack_6d8 = fVar129;
        fStack_6d4 = fVar129;
        fStack_6d0 = fVar129;
        fStack_6cc = fVar129;
        fStack_6c8 = fVar129;
        fStack_6c4 = fVar129;
        do {
          auVar97 = vpbroadcastd_avx512vl();
          auVar82 = vpor_avx2(auVar97,_DAT_01fe9900);
          uVar23 = vpcmpd_avx512vl(auVar82,local_7c0,1);
          auVar97 = *(undefined1 (*) [32])(bspline_basis0 + lVar68 * 4 + lVar24);
          auVar99 = *(undefined1 (*) [32])(lVar24 + 0x21aefac + lVar68 * 4);
          auVar95 = *(undefined1 (*) [32])(lVar24 + 0x21af430 + lVar68 * 4);
          auVar94 = *(undefined1 (*) [32])(lVar24 + 0x21af8b4 + lVar68 * 4);
          local_840 = auVar139._0_32_;
          auVar83 = vmulps_avx512vl(local_840,auVar94);
          local_860 = auVar202._0_32_;
          auVar93 = vmulps_avx512vl(local_860,auVar94);
          auVar40._4_4_ = auVar94._4_4_ * (float)local_380._4_4_;
          auVar40._0_4_ = auVar94._0_4_ * (float)local_380._0_4_;
          auVar40._8_4_ = auVar94._8_4_ * fStack_378;
          auVar40._12_4_ = auVar94._12_4_ * fStack_374;
          auVar40._16_4_ = auVar94._16_4_ * fStack_370;
          auVar40._20_4_ = auVar94._20_4_ * fStack_36c;
          auVar40._24_4_ = auVar94._24_4_ * fStack_368;
          auVar40._28_4_ = auVar82._28_4_;
          local_800 = auVar203._0_32_;
          auVar82 = vfmadd231ps_avx512vl(auVar83,auVar95,local_800);
          local_820 = auVar201._0_32_;
          auVar83 = vfmadd231ps_avx512vl(auVar93,auVar95,local_820);
          auVar93 = vfmadd231ps_avx512vl(auVar40,auVar95,local_360);
          auVar100 = auVar195._0_32_;
          auVar82 = vfmadd231ps_avx512vl(auVar82,auVar99,auVar100);
          auVar98 = auVar194._0_32_;
          auVar83 = vfmadd231ps_avx512vl(auVar83,auVar99,auVar98);
          auVar77 = vfmadd231ps_fma(auVar93,auVar99,local_340);
          auVar101 = auVar199._0_32_;
          auVar86 = vfmadd231ps_avx512vl(auVar82,auVar97,auVar101);
          auVar102 = auVar200._0_32_;
          auVar88 = vfmadd231ps_avx512vl(auVar83,auVar97,auVar102);
          auVar82 = *(undefined1 (*) [32])(bspline_basis1 + lVar68 * 4 + lVar24);
          auVar83 = *(undefined1 (*) [32])(lVar24 + 0x21b13cc + lVar68 * 4);
          auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar97,local_320);
          auVar93 = *(undefined1 (*) [32])(lVar24 + 0x21b1850 + lVar68 * 4);
          auVar84 = *(undefined1 (*) [32])(lVar24 + 0x21b1cd4 + lVar68 * 4);
          auVar87 = vmulps_avx512vl(local_840,auVar84);
          auVar85 = vmulps_avx512vl(local_860,auVar84);
          auVar41._4_4_ = auVar84._4_4_ * (float)local_380._4_4_;
          auVar41._0_4_ = auVar84._0_4_ * (float)local_380._0_4_;
          auVar41._8_4_ = auVar84._8_4_ * fStack_378;
          auVar41._12_4_ = auVar84._12_4_ * fStack_374;
          auVar41._16_4_ = auVar84._16_4_ * fStack_370;
          auVar41._20_4_ = auVar84._20_4_ * fStack_36c;
          auVar41._24_4_ = auVar84._24_4_ * fStack_368;
          auVar41._28_4_ = uStack_364;
          auVar87 = vfmadd231ps_avx512vl(auVar87,auVar93,local_800);
          auVar85 = vfmadd231ps_avx512vl(auVar85,auVar93,local_820);
          auVar89 = vfmadd231ps_avx512vl(auVar41,auVar93,local_360);
          auVar87 = vfmadd231ps_avx512vl(auVar87,auVar83,auVar100);
          auVar85 = vfmadd231ps_avx512vl(auVar85,auVar83,auVar98);
          auVar76 = vfmadd231ps_fma(auVar89,auVar83,local_340);
          auVar89 = vfmadd231ps_avx512vl(auVar87,auVar82,auVar101);
          auVar90 = vfmadd231ps_avx512vl(auVar85,auVar82,auVar102);
          auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar82,local_320);
          auVar91 = vmaxps_avx512vl(ZEXT1632(auVar77),ZEXT1632(auVar76));
          auVar87 = vsubps_avx(auVar89,auVar86);
          auVar85 = vsubps_avx(auVar90,auVar88);
          auVar92 = vmulps_avx512vl(auVar88,auVar87);
          auVar96 = vmulps_avx512vl(auVar86,auVar85);
          auVar92 = vsubps_avx512vl(auVar92,auVar96);
          auVar96 = vmulps_avx512vl(auVar85,auVar85);
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar87,auVar87);
          auVar91 = vmulps_avx512vl(auVar91,auVar91);
          auVar91 = vmulps_avx512vl(auVar91,auVar96);
          auVar92 = vmulps_avx512vl(auVar92,auVar92);
          uVar142 = vcmpps_avx512vl(auVar92,auVar91,2);
          bVar70 = (byte)uVar23 & (byte)uVar142;
          if (bVar70 == 0) {
            auVar195 = ZEXT3264(auVar100);
            auVar194 = ZEXT3264(auVar98);
          }
          else {
            auVar84 = vmulps_avx512vl(local_7a0,auVar84);
            auVar93 = vfmadd213ps_avx512vl(auVar93,local_3e0,auVar84);
            auVar83 = vfmadd213ps_avx512vl(auVar83,local_3c0,auVar93);
            auVar82 = vfmadd213ps_avx512vl(auVar82,local_3a0,auVar83);
            auVar94 = vmulps_avx512vl(local_7a0,auVar94);
            auVar95 = vfmadd213ps_avx512vl(auVar95,local_3e0,auVar94);
            auVar99 = vfmadd213ps_avx512vl(auVar99,local_3c0,auVar95);
            auVar83 = vfmadd213ps_avx512vl(auVar97,local_3a0,auVar99);
            auVar97 = *(undefined1 (*) [32])(lVar24 + 0x21afd38 + lVar68 * 4);
            auVar99 = *(undefined1 (*) [32])(lVar24 + 0x21b01bc + lVar68 * 4);
            auVar95 = *(undefined1 (*) [32])(lVar24 + 0x21b0640 + lVar68 * 4);
            auVar94 = *(undefined1 (*) [32])(lVar24 + 0x21b0ac4 + lVar68 * 4);
            auVar93 = vmulps_avx512vl(local_840,auVar94);
            auVar84 = vmulps_avx512vl(local_860,auVar94);
            auVar94 = vmulps_avx512vl(local_7a0,auVar94);
            auVar93 = vfmadd231ps_avx512vl(auVar93,auVar95,local_800);
            auVar84 = vfmadd231ps_avx512vl(auVar84,auVar95,local_820);
            auVar95 = vfmadd231ps_avx512vl(auVar94,local_3e0,auVar95);
            auVar94 = vfmadd231ps_avx512vl(auVar93,auVar99,auVar100);
            auVar93 = vfmadd231ps_avx512vl(auVar84,auVar99,auVar98);
            auVar99 = vfmadd231ps_avx512vl(auVar95,local_3c0,auVar99);
            auVar94 = vfmadd231ps_avx512vl(auVar94,auVar97,auVar101);
            auVar93 = vfmadd231ps_avx512vl(auVar93,auVar97,auVar102);
            auVar84 = vfmadd231ps_avx512vl(auVar99,local_3a0,auVar97);
            auVar97 = *(undefined1 (*) [32])(lVar24 + 0x21b2158 + lVar68 * 4);
            auVar99 = *(undefined1 (*) [32])(lVar24 + 0x21b2a60 + lVar68 * 4);
            auVar95 = *(undefined1 (*) [32])(lVar24 + 0x21b2ee4 + lVar68 * 4);
            auVar91 = vmulps_avx512vl(local_840,auVar95);
            auVar92 = vmulps_avx512vl(local_860,auVar95);
            auVar95 = vmulps_avx512vl(local_7a0,auVar95);
            auVar91 = vfmadd231ps_avx512vl(auVar91,auVar99,local_800);
            auVar92 = vfmadd231ps_avx512vl(auVar92,auVar99,local_820);
            auVar95 = vfmadd231ps_avx512vl(auVar95,local_3e0,auVar99);
            auVar99 = *(undefined1 (*) [32])(lVar24 + 0x21b25dc + lVar68 * 4);
            auVar91 = vfmadd231ps_avx512vl(auVar91,auVar99,auVar100);
            auVar92 = vfmadd231ps_avx512vl(auVar92,auVar99,auVar98);
            auVar99 = vfmadd231ps_avx512vl(auVar95,local_3c0,auVar99);
            auVar95 = vfmadd231ps_avx512vl(auVar91,auVar97,auVar101);
            auVar91 = vfmadd231ps_avx512vl(auVar92,auVar97,auVar102);
            auVar99 = vfmadd231ps_avx512vl(auVar99,local_3a0,auVar97);
            auVar92 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar94,auVar92);
            vandps_avx512vl(auVar93,auVar92);
            auVar97 = vmaxps_avx(auVar92,auVar92);
            vandps_avx512vl(auVar84,auVar92);
            auVar97 = vmaxps_avx(auVar97,auVar92);
            auVar59._4_4_ = fStack_6dc;
            auVar59._0_4_ = local_6e0;
            auVar59._8_4_ = fStack_6d8;
            auVar59._12_4_ = fStack_6d4;
            auVar59._16_4_ = fStack_6d0;
            auVar59._20_4_ = fStack_6cc;
            auVar59._24_4_ = fStack_6c8;
            auVar59._28_4_ = fStack_6c4;
            uVar61 = vcmpps_avx512vl(auVar97,auVar59,1);
            bVar12 = (bool)((byte)uVar61 & 1);
            auVar109._0_4_ = (float)((uint)bVar12 * auVar87._0_4_ | (uint)!bVar12 * auVar94._0_4_);
            bVar12 = (bool)((byte)(uVar61 >> 1) & 1);
            auVar109._4_4_ = (float)((uint)bVar12 * auVar87._4_4_ | (uint)!bVar12 * auVar94._4_4_);
            bVar12 = (bool)((byte)(uVar61 >> 2) & 1);
            auVar109._8_4_ = (float)((uint)bVar12 * auVar87._8_4_ | (uint)!bVar12 * auVar94._8_4_);
            bVar12 = (bool)((byte)(uVar61 >> 3) & 1);
            auVar109._12_4_ =
                 (float)((uint)bVar12 * auVar87._12_4_ | (uint)!bVar12 * auVar94._12_4_);
            bVar12 = (bool)((byte)(uVar61 >> 4) & 1);
            auVar109._16_4_ =
                 (float)((uint)bVar12 * auVar87._16_4_ | (uint)!bVar12 * auVar94._16_4_);
            bVar12 = (bool)((byte)(uVar61 >> 5) & 1);
            auVar109._20_4_ =
                 (float)((uint)bVar12 * auVar87._20_4_ | (uint)!bVar12 * auVar94._20_4_);
            bVar12 = (bool)((byte)(uVar61 >> 6) & 1);
            auVar109._24_4_ =
                 (float)((uint)bVar12 * auVar87._24_4_ | (uint)!bVar12 * auVar94._24_4_);
            bVar12 = SUB81(uVar61 >> 7,0);
            auVar109._28_4_ = (uint)bVar12 * auVar87._28_4_ | (uint)!bVar12 * auVar94._28_4_;
            bVar12 = (bool)((byte)uVar61 & 1);
            auVar110._0_4_ = (float)((uint)bVar12 * auVar85._0_4_ | (uint)!bVar12 * auVar93._0_4_);
            bVar12 = (bool)((byte)(uVar61 >> 1) & 1);
            auVar110._4_4_ = (float)((uint)bVar12 * auVar85._4_4_ | (uint)!bVar12 * auVar93._4_4_);
            bVar12 = (bool)((byte)(uVar61 >> 2) & 1);
            auVar110._8_4_ = (float)((uint)bVar12 * auVar85._8_4_ | (uint)!bVar12 * auVar93._8_4_);
            bVar12 = (bool)((byte)(uVar61 >> 3) & 1);
            auVar110._12_4_ =
                 (float)((uint)bVar12 * auVar85._12_4_ | (uint)!bVar12 * auVar93._12_4_);
            bVar12 = (bool)((byte)(uVar61 >> 4) & 1);
            auVar110._16_4_ =
                 (float)((uint)bVar12 * auVar85._16_4_ | (uint)!bVar12 * auVar93._16_4_);
            bVar12 = (bool)((byte)(uVar61 >> 5) & 1);
            auVar110._20_4_ =
                 (float)((uint)bVar12 * auVar85._20_4_ | (uint)!bVar12 * auVar93._20_4_);
            bVar12 = (bool)((byte)(uVar61 >> 6) & 1);
            auVar110._24_4_ =
                 (float)((uint)bVar12 * auVar85._24_4_ | (uint)!bVar12 * auVar93._24_4_);
            bVar12 = SUB81(uVar61 >> 7,0);
            auVar110._28_4_ = (uint)bVar12 * auVar85._28_4_ | (uint)!bVar12 * auVar93._28_4_;
            vandps_avx512vl(auVar95,auVar92);
            vandps_avx512vl(auVar91,auVar92);
            auVar97 = vmaxps_avx(auVar110,auVar110);
            vandps_avx512vl(auVar99,auVar92);
            auVar97 = vmaxps_avx(auVar97,auVar110);
            uVar61 = vcmpps_avx512vl(auVar97,auVar59,1);
            bVar12 = (bool)((byte)uVar61 & 1);
            auVar111._0_4_ = (uint)bVar12 * auVar87._0_4_ | (uint)!bVar12 * auVar95._0_4_;
            bVar12 = (bool)((byte)(uVar61 >> 1) & 1);
            auVar111._4_4_ = (uint)bVar12 * auVar87._4_4_ | (uint)!bVar12 * auVar95._4_4_;
            bVar12 = (bool)((byte)(uVar61 >> 2) & 1);
            auVar111._8_4_ = (uint)bVar12 * auVar87._8_4_ | (uint)!bVar12 * auVar95._8_4_;
            bVar12 = (bool)((byte)(uVar61 >> 3) & 1);
            auVar111._12_4_ = (uint)bVar12 * auVar87._12_4_ | (uint)!bVar12 * auVar95._12_4_;
            bVar12 = (bool)((byte)(uVar61 >> 4) & 1);
            auVar111._16_4_ = (uint)bVar12 * auVar87._16_4_ | (uint)!bVar12 * auVar95._16_4_;
            bVar12 = (bool)((byte)(uVar61 >> 5) & 1);
            auVar111._20_4_ = (uint)bVar12 * auVar87._20_4_ | (uint)!bVar12 * auVar95._20_4_;
            bVar12 = (bool)((byte)(uVar61 >> 6) & 1);
            auVar111._24_4_ = (uint)bVar12 * auVar87._24_4_ | (uint)!bVar12 * auVar95._24_4_;
            bVar12 = SUB81(uVar61 >> 7,0);
            auVar111._28_4_ = (uint)bVar12 * auVar87._28_4_ | (uint)!bVar12 * auVar95._28_4_;
            bVar12 = (bool)((byte)uVar61 & 1);
            auVar112._0_4_ = (float)((uint)bVar12 * auVar85._0_4_ | (uint)!bVar12 * auVar91._0_4_);
            bVar12 = (bool)((byte)(uVar61 >> 1) & 1);
            auVar112._4_4_ = (float)((uint)bVar12 * auVar85._4_4_ | (uint)!bVar12 * auVar91._4_4_);
            bVar12 = (bool)((byte)(uVar61 >> 2) & 1);
            auVar112._8_4_ = (float)((uint)bVar12 * auVar85._8_4_ | (uint)!bVar12 * auVar91._8_4_);
            bVar12 = (bool)((byte)(uVar61 >> 3) & 1);
            auVar112._12_4_ =
                 (float)((uint)bVar12 * auVar85._12_4_ | (uint)!bVar12 * auVar91._12_4_);
            bVar12 = (bool)((byte)(uVar61 >> 4) & 1);
            auVar112._16_4_ =
                 (float)((uint)bVar12 * auVar85._16_4_ | (uint)!bVar12 * auVar91._16_4_);
            bVar12 = (bool)((byte)(uVar61 >> 5) & 1);
            auVar112._20_4_ =
                 (float)((uint)bVar12 * auVar85._20_4_ | (uint)!bVar12 * auVar91._20_4_);
            bVar12 = (bool)((byte)(uVar61 >> 6) & 1);
            auVar112._24_4_ =
                 (float)((uint)bVar12 * auVar85._24_4_ | (uint)!bVar12 * auVar91._24_4_);
            bVar12 = SUB81(uVar61 >> 7,0);
            auVar112._28_4_ = (uint)bVar12 * auVar85._28_4_ | (uint)!bVar12 * auVar91._28_4_;
            auVar182._8_4_ = 0x80000000;
            auVar182._0_8_ = 0x8000000080000000;
            auVar182._12_4_ = 0x80000000;
            auVar182._16_4_ = 0x80000000;
            auVar182._20_4_ = 0x80000000;
            auVar182._24_4_ = 0x80000000;
            auVar182._28_4_ = 0x80000000;
            auVar97 = vxorps_avx512vl(auVar111,auVar182);
            auVar91 = auVar198._0_32_;
            auVar99 = vfmadd213ps_avx512vl(auVar109,auVar109,auVar91);
            auVar78 = vfmadd231ps_fma(auVar99,auVar110,auVar110);
            auVar99 = vrsqrt14ps_avx512vl(ZEXT1632(auVar78));
            auVar191._8_4_ = 0xbf000000;
            auVar191._0_8_ = 0xbf000000bf000000;
            auVar191._12_4_ = 0xbf000000;
            auVar191._16_4_ = 0xbf000000;
            auVar191._20_4_ = 0xbf000000;
            auVar191._24_4_ = 0xbf000000;
            auVar191._28_4_ = 0xbf000000;
            fVar129 = auVar99._0_4_;
            fVar153 = auVar99._4_4_;
            fVar140 = auVar99._8_4_;
            fVar141 = auVar99._12_4_;
            fVar172 = auVar99._16_4_;
            fVar171 = auVar99._20_4_;
            fVar175 = auVar99._24_4_;
            auVar42._4_4_ = fVar153 * fVar153 * fVar153 * auVar78._4_4_ * -0.5;
            auVar42._0_4_ = fVar129 * fVar129 * fVar129 * auVar78._0_4_ * -0.5;
            auVar42._8_4_ = fVar140 * fVar140 * fVar140 * auVar78._8_4_ * -0.5;
            auVar42._12_4_ = fVar141 * fVar141 * fVar141 * auVar78._12_4_ * -0.5;
            auVar42._16_4_ = fVar172 * fVar172 * fVar172 * -0.0;
            auVar42._20_4_ = fVar171 * fVar171 * fVar171 * -0.0;
            auVar42._24_4_ = fVar175 * fVar175 * fVar175 * -0.0;
            auVar42._28_4_ = auVar110._28_4_;
            auVar95 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar99 = vfmadd231ps_avx512vl(auVar42,auVar95,auVar99);
            auVar43._4_4_ = auVar110._4_4_ * auVar99._4_4_;
            auVar43._0_4_ = auVar110._0_4_ * auVar99._0_4_;
            auVar43._8_4_ = auVar110._8_4_ * auVar99._8_4_;
            auVar43._12_4_ = auVar110._12_4_ * auVar99._12_4_;
            auVar43._16_4_ = auVar110._16_4_ * auVar99._16_4_;
            auVar43._20_4_ = auVar110._20_4_ * auVar99._20_4_;
            auVar43._24_4_ = auVar110._24_4_ * auVar99._24_4_;
            auVar43._28_4_ = 0;
            auVar44._4_4_ = auVar99._4_4_ * -auVar109._4_4_;
            auVar44._0_4_ = auVar99._0_4_ * -auVar109._0_4_;
            auVar44._8_4_ = auVar99._8_4_ * -auVar109._8_4_;
            auVar44._12_4_ = auVar99._12_4_ * -auVar109._12_4_;
            auVar44._16_4_ = auVar99._16_4_ * -auVar109._16_4_;
            auVar44._20_4_ = auVar99._20_4_ * -auVar109._20_4_;
            auVar44._24_4_ = auVar99._24_4_ * -auVar109._24_4_;
            auVar44._28_4_ = auVar110._28_4_;
            auVar94 = vmulps_avx512vl(auVar99,auVar91);
            auVar99 = vfmadd213ps_avx512vl(auVar111,auVar111,auVar91);
            auVar99 = vfmadd231ps_avx512vl(auVar99,auVar112,auVar112);
            auVar93 = vrsqrt14ps_avx512vl(auVar99);
            auVar99 = vmulps_avx512vl(auVar99,auVar191);
            fVar129 = auVar93._0_4_;
            fVar153 = auVar93._4_4_;
            fVar140 = auVar93._8_4_;
            fVar141 = auVar93._12_4_;
            fVar172 = auVar93._16_4_;
            fVar171 = auVar93._20_4_;
            fVar175 = auVar93._24_4_;
            auVar45._4_4_ = fVar153 * fVar153 * fVar153 * auVar99._4_4_;
            auVar45._0_4_ = fVar129 * fVar129 * fVar129 * auVar99._0_4_;
            auVar45._8_4_ = fVar140 * fVar140 * fVar140 * auVar99._8_4_;
            auVar45._12_4_ = fVar141 * fVar141 * fVar141 * auVar99._12_4_;
            auVar45._16_4_ = fVar172 * fVar172 * fVar172 * auVar99._16_4_;
            auVar45._20_4_ = fVar171 * fVar171 * fVar171 * auVar99._20_4_;
            auVar45._24_4_ = fVar175 * fVar175 * fVar175 * auVar99._24_4_;
            auVar45._28_4_ = auVar99._28_4_;
            auVar99 = vfmadd231ps_avx512vl(auVar45,auVar95,auVar93);
            auVar46._4_4_ = auVar112._4_4_ * auVar99._4_4_;
            auVar46._0_4_ = auVar112._0_4_ * auVar99._0_4_;
            auVar46._8_4_ = auVar112._8_4_ * auVar99._8_4_;
            auVar46._12_4_ = auVar112._12_4_ * auVar99._12_4_;
            auVar46._16_4_ = auVar112._16_4_ * auVar99._16_4_;
            auVar46._20_4_ = auVar112._20_4_ * auVar99._20_4_;
            auVar46._24_4_ = auVar112._24_4_ * auVar99._24_4_;
            auVar46._28_4_ = auVar93._28_4_;
            auVar47._4_4_ = auVar99._4_4_ * auVar97._4_4_;
            auVar47._0_4_ = auVar99._0_4_ * auVar97._0_4_;
            auVar47._8_4_ = auVar99._8_4_ * auVar97._8_4_;
            auVar47._12_4_ = auVar99._12_4_ * auVar97._12_4_;
            auVar47._16_4_ = auVar99._16_4_ * auVar97._16_4_;
            auVar47._20_4_ = auVar99._20_4_ * auVar97._20_4_;
            auVar47._24_4_ = auVar99._24_4_ * auVar97._24_4_;
            auVar47._28_4_ = auVar97._28_4_;
            auVar97 = vmulps_avx512vl(auVar99,auVar91);
            auVar78 = vfmadd213ps_fma(auVar43,ZEXT1632(auVar77),auVar86);
            auVar99 = ZEXT1632(auVar77);
            auVar197 = vfmadd213ps_fma(auVar44,auVar99,auVar88);
            auVar95 = vfmadd213ps_avx512vl(auVar94,auVar99,auVar83);
            auVar93 = vfmadd213ps_avx512vl(auVar46,ZEXT1632(auVar76),auVar89);
            auVar22 = vfnmadd213ps_fma(auVar43,auVar99,auVar86);
            auVar84 = ZEXT1632(auVar76);
            auVar18 = vfmadd213ps_fma(auVar47,auVar84,auVar90);
            auVar79 = vfnmadd213ps_fma(auVar44,auVar99,auVar88);
            auVar19 = vfmadd213ps_fma(auVar97,auVar84,auVar82);
            auVar88 = ZEXT1632(auVar77);
            auVar81 = vfnmadd231ps_fma(auVar83,auVar88,auVar94);
            auVar80 = vfnmadd213ps_fma(auVar46,auVar84,auVar89);
            auVar26 = vfnmadd213ps_fma(auVar47,auVar84,auVar90);
            auVar27 = vfnmadd231ps_fma(auVar82,ZEXT1632(auVar76),auVar97);
            auVar82 = vsubps_avx512vl(auVar93,ZEXT1632(auVar22));
            auVar97 = vsubps_avx(ZEXT1632(auVar18),ZEXT1632(auVar79));
            auVar99 = vsubps_avx(ZEXT1632(auVar19),ZEXT1632(auVar81));
            auVar48._4_4_ = auVar97._4_4_ * auVar81._4_4_;
            auVar48._0_4_ = auVar97._0_4_ * auVar81._0_4_;
            auVar48._8_4_ = auVar97._8_4_ * auVar81._8_4_;
            auVar48._12_4_ = auVar97._12_4_ * auVar81._12_4_;
            auVar48._16_4_ = auVar97._16_4_ * 0.0;
            auVar48._20_4_ = auVar97._20_4_ * 0.0;
            auVar48._24_4_ = auVar97._24_4_ * 0.0;
            auVar48._28_4_ = auVar94._28_4_;
            auVar77 = vfmsub231ps_fma(auVar48,ZEXT1632(auVar79),auVar99);
            auVar49._4_4_ = auVar99._4_4_ * auVar22._4_4_;
            auVar49._0_4_ = auVar99._0_4_ * auVar22._0_4_;
            auVar49._8_4_ = auVar99._8_4_ * auVar22._8_4_;
            auVar49._12_4_ = auVar99._12_4_ * auVar22._12_4_;
            auVar49._16_4_ = auVar99._16_4_ * 0.0;
            auVar49._20_4_ = auVar99._20_4_ * 0.0;
            auVar49._24_4_ = auVar99._24_4_ * 0.0;
            auVar49._28_4_ = auVar99._28_4_;
            auVar20 = vfmsub231ps_fma(auVar49,ZEXT1632(auVar81),auVar82);
            auVar50._4_4_ = auVar79._4_4_ * auVar82._4_4_;
            auVar50._0_4_ = auVar79._0_4_ * auVar82._0_4_;
            auVar50._8_4_ = auVar79._8_4_ * auVar82._8_4_;
            auVar50._12_4_ = auVar79._12_4_ * auVar82._12_4_;
            auVar50._16_4_ = auVar82._16_4_ * 0.0;
            auVar50._20_4_ = auVar82._20_4_ * 0.0;
            auVar50._24_4_ = auVar82._24_4_ * 0.0;
            auVar50._28_4_ = auVar82._28_4_;
            auVar21 = vfmsub231ps_fma(auVar50,ZEXT1632(auVar22),auVar97);
            auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar21),auVar91,ZEXT1632(auVar20));
            auVar97 = vfmadd231ps_avx512vl(auVar97,auVar91,ZEXT1632(auVar77));
            uVar61 = vcmpps_avx512vl(auVar97,auVar91,2);
            bVar60 = (byte)uVar61;
            fVar121 = (float)((uint)(bVar60 & 1) * auVar78._0_4_ |
                             (uint)!(bool)(bVar60 & 1) * auVar80._0_4_);
            bVar12 = (bool)((byte)(uVar61 >> 1) & 1);
            fVar123 = (float)((uint)bVar12 * auVar78._4_4_ | (uint)!bVar12 * auVar80._4_4_);
            bVar12 = (bool)((byte)(uVar61 >> 2) & 1);
            fVar125 = (float)((uint)bVar12 * auVar78._8_4_ | (uint)!bVar12 * auVar80._8_4_);
            bVar12 = (bool)((byte)(uVar61 >> 3) & 1);
            fVar127 = (float)((uint)bVar12 * auVar78._12_4_ | (uint)!bVar12 * auVar80._12_4_);
            auVar84 = ZEXT1632(CONCAT412(fVar127,CONCAT48(fVar125,CONCAT44(fVar123,fVar121))));
            fVar122 = (float)((uint)(bVar60 & 1) * auVar197._0_4_ |
                             (uint)!(bool)(bVar60 & 1) * auVar26._0_4_);
            bVar12 = (bool)((byte)(uVar61 >> 1) & 1);
            fVar124 = (float)((uint)bVar12 * auVar197._4_4_ | (uint)!bVar12 * auVar26._4_4_);
            bVar12 = (bool)((byte)(uVar61 >> 2) & 1);
            fVar126 = (float)((uint)bVar12 * auVar197._8_4_ | (uint)!bVar12 * auVar26._8_4_);
            bVar12 = (bool)((byte)(uVar61 >> 3) & 1);
            fVar128 = (float)((uint)bVar12 * auVar197._12_4_ | (uint)!bVar12 * auVar26._12_4_);
            auVar87 = ZEXT1632(CONCAT412(fVar128,CONCAT48(fVar126,CONCAT44(fVar124,fVar122))));
            auVar113._0_4_ =
                 (float)((uint)(bVar60 & 1) * auVar95._0_4_ |
                        (uint)!(bool)(bVar60 & 1) * auVar27._0_4_);
            bVar12 = (bool)((byte)(uVar61 >> 1) & 1);
            auVar113._4_4_ = (float)((uint)bVar12 * auVar95._4_4_ | (uint)!bVar12 * auVar27._4_4_);
            bVar12 = (bool)((byte)(uVar61 >> 2) & 1);
            auVar113._8_4_ = (float)((uint)bVar12 * auVar95._8_4_ | (uint)!bVar12 * auVar27._8_4_);
            bVar12 = (bool)((byte)(uVar61 >> 3) & 1);
            auVar113._12_4_ =
                 (float)((uint)bVar12 * auVar95._12_4_ | (uint)!bVar12 * auVar27._12_4_);
            fVar129 = (float)((uint)((byte)(uVar61 >> 4) & 1) * auVar95._16_4_);
            auVar113._16_4_ = fVar129;
            fVar153 = (float)((uint)((byte)(uVar61 >> 5) & 1) * auVar95._20_4_);
            auVar113._20_4_ = fVar153;
            fVar140 = (float)((uint)((byte)(uVar61 >> 6) & 1) * auVar95._24_4_);
            auVar113._24_4_ = fVar140;
            iVar1 = (uint)(byte)(uVar61 >> 7) * auVar95._28_4_;
            auVar113._28_4_ = iVar1;
            auVar97 = vblendmps_avx512vl(ZEXT1632(auVar22),auVar93);
            auVar114._0_4_ =
                 (uint)(bVar60 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar77._0_4_;
            bVar12 = (bool)((byte)(uVar61 >> 1) & 1);
            auVar114._4_4_ = (uint)bVar12 * auVar97._4_4_ | (uint)!bVar12 * auVar77._4_4_;
            bVar12 = (bool)((byte)(uVar61 >> 2) & 1);
            auVar114._8_4_ = (uint)bVar12 * auVar97._8_4_ | (uint)!bVar12 * auVar77._8_4_;
            bVar12 = (bool)((byte)(uVar61 >> 3) & 1);
            auVar114._12_4_ = (uint)bVar12 * auVar97._12_4_ | (uint)!bVar12 * auVar77._12_4_;
            auVar114._16_4_ = (uint)((byte)(uVar61 >> 4) & 1) * auVar97._16_4_;
            auVar114._20_4_ = (uint)((byte)(uVar61 >> 5) & 1) * auVar97._20_4_;
            auVar114._24_4_ = (uint)((byte)(uVar61 >> 6) & 1) * auVar97._24_4_;
            auVar114._28_4_ = (uint)(byte)(uVar61 >> 7) * auVar97._28_4_;
            auVar97 = vblendmps_avx512vl(ZEXT1632(auVar79),ZEXT1632(auVar18));
            auVar115._0_4_ =
                 (float)((uint)(bVar60 & 1) * auVar97._0_4_ |
                        (uint)!(bool)(bVar60 & 1) * auVar78._0_4_);
            bVar12 = (bool)((byte)(uVar61 >> 1) & 1);
            auVar115._4_4_ = (float)((uint)bVar12 * auVar97._4_4_ | (uint)!bVar12 * auVar78._4_4_);
            bVar12 = (bool)((byte)(uVar61 >> 2) & 1);
            auVar115._8_4_ = (float)((uint)bVar12 * auVar97._8_4_ | (uint)!bVar12 * auVar78._8_4_);
            bVar12 = (bool)((byte)(uVar61 >> 3) & 1);
            auVar115._12_4_ =
                 (float)((uint)bVar12 * auVar97._12_4_ | (uint)!bVar12 * auVar78._12_4_);
            fVar171 = (float)((uint)((byte)(uVar61 >> 4) & 1) * auVar97._16_4_);
            auVar115._16_4_ = fVar171;
            fVar172 = (float)((uint)((byte)(uVar61 >> 5) & 1) * auVar97._20_4_);
            auVar115._20_4_ = fVar172;
            fVar141 = (float)((uint)((byte)(uVar61 >> 6) & 1) * auVar97._24_4_);
            auVar115._24_4_ = fVar141;
            auVar115._28_4_ = (uint)(byte)(uVar61 >> 7) * auVar97._28_4_;
            auVar97 = vblendmps_avx512vl(ZEXT1632(auVar81),ZEXT1632(auVar19));
            auVar116._0_4_ =
                 (float)((uint)(bVar60 & 1) * auVar97._0_4_ |
                        (uint)!(bool)(bVar60 & 1) * auVar197._0_4_);
            bVar12 = (bool)((byte)(uVar61 >> 1) & 1);
            auVar116._4_4_ = (float)((uint)bVar12 * auVar97._4_4_ | (uint)!bVar12 * auVar197._4_4_);
            bVar12 = (bool)((byte)(uVar61 >> 2) & 1);
            auVar116._8_4_ = (float)((uint)bVar12 * auVar97._8_4_ | (uint)!bVar12 * auVar197._8_4_);
            bVar12 = (bool)((byte)(uVar61 >> 3) & 1);
            auVar116._12_4_ =
                 (float)((uint)bVar12 * auVar97._12_4_ | (uint)!bVar12 * auVar197._12_4_);
            fVar72 = (float)((uint)((byte)(uVar61 >> 4) & 1) * auVar97._16_4_);
            auVar116._16_4_ = fVar72;
            fVar71 = (float)((uint)((byte)(uVar61 >> 5) & 1) * auVar97._20_4_);
            auVar116._20_4_ = fVar71;
            fVar175 = (float)((uint)((byte)(uVar61 >> 6) & 1) * auVar97._24_4_);
            auVar116._24_4_ = fVar175;
            iVar2 = (uint)(byte)(uVar61 >> 7) * auVar97._28_4_;
            auVar116._28_4_ = iVar2;
            auVar117._0_4_ =
                 (uint)(bVar60 & 1) * (int)auVar22._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar93._0_4_
            ;
            bVar12 = (bool)((byte)(uVar61 >> 1) & 1);
            auVar117._4_4_ = (uint)bVar12 * (int)auVar22._4_4_ | (uint)!bVar12 * auVar93._4_4_;
            bVar12 = (bool)((byte)(uVar61 >> 2) & 1);
            auVar117._8_4_ = (uint)bVar12 * (int)auVar22._8_4_ | (uint)!bVar12 * auVar93._8_4_;
            bVar12 = (bool)((byte)(uVar61 >> 3) & 1);
            auVar117._12_4_ = (uint)bVar12 * (int)auVar22._12_4_ | (uint)!bVar12 * auVar93._12_4_;
            auVar117._16_4_ = (uint)!(bool)((byte)(uVar61 >> 4) & 1) * auVar93._16_4_;
            auVar117._20_4_ = (uint)!(bool)((byte)(uVar61 >> 5) & 1) * auVar93._20_4_;
            auVar117._24_4_ = (uint)!(bool)((byte)(uVar61 >> 6) & 1) * auVar93._24_4_;
            auVar117._28_4_ = (uint)!SUB81(uVar61 >> 7,0) * auVar93._28_4_;
            bVar12 = (bool)((byte)(uVar61 >> 1) & 1);
            bVar14 = (bool)((byte)(uVar61 >> 2) & 1);
            bVar16 = (bool)((byte)(uVar61 >> 3) & 1);
            bVar13 = (bool)((byte)(uVar61 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar61 >> 2) & 1);
            bVar17 = (bool)((byte)(uVar61 >> 3) & 1);
            auVar93 = vsubps_avx512vl(auVar117,auVar84);
            auVar99 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar79._12_4_ |
                                                    (uint)!bVar16 * auVar18._12_4_,
                                                    CONCAT48((uint)bVar14 * (int)auVar79._8_4_ |
                                                             (uint)!bVar14 * auVar18._8_4_,
                                                             CONCAT44((uint)bVar12 *
                                                                      (int)auVar79._4_4_ |
                                                                      (uint)!bVar12 * auVar18._4_4_,
                                                                      (uint)(bVar60 & 1) *
                                                                      (int)auVar79._0_4_ |
                                                                      (uint)!(bool)(bVar60 & 1) *
                                                                      auVar18._0_4_)))),auVar87);
            auVar95 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar81._12_4_ |
                                                    (uint)!bVar17 * auVar19._12_4_,
                                                    CONCAT48((uint)bVar15 * (int)auVar81._8_4_ |
                                                             (uint)!bVar15 * auVar19._8_4_,
                                                             CONCAT44((uint)bVar13 *
                                                                      (int)auVar81._4_4_ |
                                                                      (uint)!bVar13 * auVar19._4_4_,
                                                                      (uint)(bVar60 & 1) *
                                                                      (int)auVar81._0_4_ |
                                                                      (uint)!(bool)(bVar60 & 1) *
                                                                      auVar19._0_4_)))),auVar113);
            auVar94 = vsubps_avx(auVar84,auVar114);
            auVar82 = vsubps_avx(auVar87,auVar115);
            auVar83 = vsubps_avx(auVar113,auVar116);
            auVar51._4_4_ = auVar95._4_4_ * fVar123;
            auVar51._0_4_ = auVar95._0_4_ * fVar121;
            auVar51._8_4_ = auVar95._8_4_ * fVar125;
            auVar51._12_4_ = auVar95._12_4_ * fVar127;
            auVar51._16_4_ = auVar95._16_4_ * 0.0;
            auVar51._20_4_ = auVar95._20_4_ * 0.0;
            auVar51._24_4_ = auVar95._24_4_ * 0.0;
            auVar51._28_4_ = 0;
            auVar77 = vfmsub231ps_fma(auVar51,auVar113,auVar93);
            auVar157._0_4_ = fVar122 * auVar93._0_4_;
            auVar157._4_4_ = fVar124 * auVar93._4_4_;
            auVar157._8_4_ = fVar126 * auVar93._8_4_;
            auVar157._12_4_ = fVar128 * auVar93._12_4_;
            auVar157._16_4_ = auVar93._16_4_ * 0.0;
            auVar157._20_4_ = auVar93._20_4_ * 0.0;
            auVar157._24_4_ = auVar93._24_4_ * 0.0;
            auVar157._28_4_ = 0;
            auVar78 = vfmsub231ps_fma(auVar157,auVar84,auVar99);
            auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar78),auVar91,ZEXT1632(auVar77));
            auVar164._0_4_ = auVar99._0_4_ * auVar113._0_4_;
            auVar164._4_4_ = auVar99._4_4_ * auVar113._4_4_;
            auVar164._8_4_ = auVar99._8_4_ * auVar113._8_4_;
            auVar164._12_4_ = auVar99._12_4_ * auVar113._12_4_;
            auVar164._16_4_ = auVar99._16_4_ * fVar129;
            auVar164._20_4_ = auVar99._20_4_ * fVar153;
            auVar164._24_4_ = auVar99._24_4_ * fVar140;
            auVar164._28_4_ = 0;
            auVar77 = vfmsub231ps_fma(auVar164,auVar87,auVar95);
            auVar85 = vfmadd231ps_avx512vl(auVar97,auVar91,ZEXT1632(auVar77));
            auVar97 = vmulps_avx512vl(auVar83,auVar114);
            auVar97 = vfmsub231ps_avx512vl(auVar97,auVar94,auVar116);
            auVar52._4_4_ = auVar82._4_4_ * auVar116._4_4_;
            auVar52._0_4_ = auVar82._0_4_ * auVar116._0_4_;
            auVar52._8_4_ = auVar82._8_4_ * auVar116._8_4_;
            auVar52._12_4_ = auVar82._12_4_ * auVar116._12_4_;
            auVar52._16_4_ = auVar82._16_4_ * fVar72;
            auVar52._20_4_ = auVar82._20_4_ * fVar71;
            auVar52._24_4_ = auVar82._24_4_ * fVar175;
            auVar52._28_4_ = iVar2;
            auVar77 = vfmsub231ps_fma(auVar52,auVar115,auVar83);
            auVar165._0_4_ = auVar115._0_4_ * auVar94._0_4_;
            auVar165._4_4_ = auVar115._4_4_ * auVar94._4_4_;
            auVar165._8_4_ = auVar115._8_4_ * auVar94._8_4_;
            auVar165._12_4_ = auVar115._12_4_ * auVar94._12_4_;
            auVar165._16_4_ = fVar171 * auVar94._16_4_;
            auVar165._20_4_ = fVar172 * auVar94._20_4_;
            auVar165._24_4_ = fVar141 * auVar94._24_4_;
            auVar165._28_4_ = 0;
            auVar78 = vfmsub231ps_fma(auVar165,auVar82,auVar114);
            auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar78),auVar91,auVar97);
            auVar86 = vfmadd231ps_avx512vl(auVar97,auVar91,ZEXT1632(auVar77));
            auVar97 = vmaxps_avx(auVar85,auVar86);
            uVar142 = vcmpps_avx512vl(auVar97,auVar91,2);
            bVar70 = bVar70 & (byte)uVar142;
            if (bVar70 != 0) {
              uVar130 = *(undefined4 *)(ray + k * 4 + 0x200);
              auVar188._4_4_ = uVar130;
              auVar188._0_4_ = uVar130;
              auVar188._8_4_ = uVar130;
              auVar188._12_4_ = uVar130;
              auVar188._16_4_ = uVar130;
              auVar188._20_4_ = uVar130;
              auVar188._24_4_ = uVar130;
              auVar188._28_4_ = uVar130;
              auVar192 = ZEXT3264(auVar188);
              auVar53._4_4_ = auVar83._4_4_ * auVar99._4_4_;
              auVar53._0_4_ = auVar83._0_4_ * auVar99._0_4_;
              auVar53._8_4_ = auVar83._8_4_ * auVar99._8_4_;
              auVar53._12_4_ = auVar83._12_4_ * auVar99._12_4_;
              auVar53._16_4_ = auVar83._16_4_ * auVar99._16_4_;
              auVar53._20_4_ = auVar83._20_4_ * auVar99._20_4_;
              auVar53._24_4_ = auVar83._24_4_ * auVar99._24_4_;
              auVar53._28_4_ = auVar97._28_4_;
              auVar197 = vfmsub231ps_fma(auVar53,auVar82,auVar95);
              auVar54._4_4_ = auVar95._4_4_ * auVar94._4_4_;
              auVar54._0_4_ = auVar95._0_4_ * auVar94._0_4_;
              auVar54._8_4_ = auVar95._8_4_ * auVar94._8_4_;
              auVar54._12_4_ = auVar95._12_4_ * auVar94._12_4_;
              auVar54._16_4_ = auVar95._16_4_ * auVar94._16_4_;
              auVar54._20_4_ = auVar95._20_4_ * auVar94._20_4_;
              auVar54._24_4_ = auVar95._24_4_ * auVar94._24_4_;
              auVar54._28_4_ = auVar95._28_4_;
              auVar78 = vfmsub231ps_fma(auVar54,auVar93,auVar83);
              auVar55._4_4_ = auVar82._4_4_ * auVar93._4_4_;
              auVar55._0_4_ = auVar82._0_4_ * auVar93._0_4_;
              auVar55._8_4_ = auVar82._8_4_ * auVar93._8_4_;
              auVar55._12_4_ = auVar82._12_4_ * auVar93._12_4_;
              auVar55._16_4_ = auVar82._16_4_ * auVar93._16_4_;
              auVar55._20_4_ = auVar82._20_4_ * auVar93._20_4_;
              auVar55._24_4_ = auVar82._24_4_ * auVar93._24_4_;
              auVar55._28_4_ = auVar82._28_4_;
              auVar18 = vfmsub231ps_fma(auVar55,auVar94,auVar99);
              auVar77 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar78),ZEXT1632(auVar18));
              auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar77),ZEXT1632(auVar197),auVar91);
              auVar99 = vrcp14ps_avx512vl(auVar97);
              auVar94 = auVar196._0_32_;
              auVar95 = vfnmadd213ps_avx512vl(auVar99,auVar97,auVar94);
              auVar77 = vfmadd132ps_fma(auVar95,auVar99,auVar99);
              auVar56._4_4_ = auVar18._4_4_ * auVar113._4_4_;
              auVar56._0_4_ = auVar18._0_4_ * auVar113._0_4_;
              auVar56._8_4_ = auVar18._8_4_ * auVar113._8_4_;
              auVar56._12_4_ = auVar18._12_4_ * auVar113._12_4_;
              auVar56._16_4_ = fVar129 * 0.0;
              auVar56._20_4_ = fVar153 * 0.0;
              auVar56._24_4_ = fVar140 * 0.0;
              auVar56._28_4_ = iVar1;
              auVar78 = vfmadd231ps_fma(auVar56,auVar87,ZEXT1632(auVar78));
              auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar84,ZEXT1632(auVar197));
              fVar129 = auVar77._0_4_;
              fVar153 = auVar77._4_4_;
              fVar140 = auVar77._8_4_;
              fVar141 = auVar77._12_4_;
              local_600 = ZEXT1632(CONCAT412(auVar78._12_4_ * fVar141,
                                             CONCAT48(auVar78._8_4_ * fVar140,
                                                      CONCAT44(auVar78._4_4_ * fVar153,
                                                               auVar78._0_4_ * fVar129))));
              uVar142 = vcmpps_avx512vl(local_600,auVar188,2);
              auVar58._4_4_ = uStack_6fc;
              auVar58._0_4_ = local_700;
              auVar58._8_4_ = uStack_6f8;
              auVar58._12_4_ = uStack_6f4;
              auVar58._16_4_ = uStack_6f0;
              auVar58._20_4_ = uStack_6ec;
              auVar58._24_4_ = uStack_6e8;
              auVar58._28_4_ = uStack_6e4;
              uVar23 = vcmpps_avx512vl(local_600,auVar58,0xd);
              bVar70 = (byte)uVar142 & (byte)uVar23 & bVar70;
              if (bVar70 != 0) {
                uVar142 = vcmpps_avx512vl(auVar97,auVar91,4);
                bVar70 = bVar70 & (byte)uVar142;
                auVar195 = ZEXT3264(local_8c0);
                auVar194 = ZEXT3264(local_8e0);
                if (bVar70 != 0) {
                  fVar172 = auVar85._0_4_ * fVar129;
                  fVar171 = auVar85._4_4_ * fVar153;
                  auVar57._4_4_ = fVar171;
                  auVar57._0_4_ = fVar172;
                  fVar175 = auVar85._8_4_ * fVar140;
                  auVar57._8_4_ = fVar175;
                  fVar71 = auVar85._12_4_ * fVar141;
                  auVar57._12_4_ = fVar71;
                  fVar72 = auVar85._16_4_ * 0.0;
                  auVar57._16_4_ = fVar72;
                  fVar121 = auVar85._20_4_ * 0.0;
                  auVar57._20_4_ = fVar121;
                  fVar122 = auVar85._24_4_ * 0.0;
                  auVar57._24_4_ = fVar122;
                  auVar57._28_4_ = auVar97._28_4_;
                  auVar99 = vsubps_avx512vl(auVar94,auVar57);
                  local_640._0_4_ =
                       (float)((uint)(bVar60 & 1) * (int)fVar172 |
                              (uint)!(bool)(bVar60 & 1) * auVar99._0_4_);
                  bVar12 = (bool)((byte)(uVar61 >> 1) & 1);
                  local_640._4_4_ =
                       (float)((uint)bVar12 * (int)fVar171 | (uint)!bVar12 * auVar99._4_4_);
                  bVar12 = (bool)((byte)(uVar61 >> 2) & 1);
                  local_640._8_4_ =
                       (float)((uint)bVar12 * (int)fVar175 | (uint)!bVar12 * auVar99._8_4_);
                  bVar12 = (bool)((byte)(uVar61 >> 3) & 1);
                  local_640._12_4_ =
                       (float)((uint)bVar12 * (int)fVar71 | (uint)!bVar12 * auVar99._12_4_);
                  bVar12 = (bool)((byte)(uVar61 >> 4) & 1);
                  local_640._16_4_ =
                       (float)((uint)bVar12 * (int)fVar72 | (uint)!bVar12 * auVar99._16_4_);
                  bVar12 = (bool)((byte)(uVar61 >> 5) & 1);
                  local_640._20_4_ =
                       (float)((uint)bVar12 * (int)fVar121 | (uint)!bVar12 * auVar99._20_4_);
                  bVar12 = (bool)((byte)(uVar61 >> 6) & 1);
                  local_640._24_4_ =
                       (float)((uint)bVar12 * (int)fVar122 | (uint)!bVar12 * auVar99._24_4_);
                  bVar12 = SUB81(uVar61 >> 7,0);
                  local_640._28_4_ =
                       (float)((uint)bVar12 * auVar97._28_4_ | (uint)!bVar12 * auVar99._28_4_);
                  auVar97 = vsubps_avx(ZEXT1632(auVar76),auVar88);
                  auVar77 = vfmadd213ps_fma(auVar97,local_640,auVar88);
                  uVar130 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
                  auVar33._4_4_ = uVar130;
                  auVar33._0_4_ = uVar130;
                  auVar33._8_4_ = uVar130;
                  auVar33._12_4_ = uVar130;
                  auVar33._16_4_ = uVar130;
                  auVar33._20_4_ = uVar130;
                  auVar33._24_4_ = uVar130;
                  auVar33._28_4_ = uVar130;
                  auVar97 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar77._12_4_ + auVar77._12_4_,
                                                               CONCAT48(auVar77._8_4_ +
                                                                        auVar77._8_4_,
                                                                        CONCAT44(auVar77._4_4_ +
                                                                                 auVar77._4_4_,
                                                                                 auVar77._0_4_ +
                                                                                 auVar77._0_4_)))),
                                            auVar33);
                  uVar142 = vcmpps_avx512vl(local_600,auVar97,6);
                  if (((byte)uVar142 & bVar70) != 0) {
                    auVar147._0_4_ = auVar86._0_4_ * fVar129;
                    auVar147._4_4_ = auVar86._4_4_ * fVar153;
                    auVar147._8_4_ = auVar86._8_4_ * fVar140;
                    auVar147._12_4_ = auVar86._12_4_ * fVar141;
                    auVar147._16_4_ = auVar86._16_4_ * 0.0;
                    auVar147._20_4_ = auVar86._20_4_ * 0.0;
                    auVar147._24_4_ = auVar86._24_4_ * 0.0;
                    auVar147._28_4_ = 0;
                    auVar97 = vsubps_avx512vl(auVar94,auVar147);
                    auVar118._0_4_ =
                         (uint)(bVar60 & 1) * (int)auVar147._0_4_ |
                         (uint)!(bool)(bVar60 & 1) * auVar97._0_4_;
                    bVar12 = (bool)((byte)(uVar61 >> 1) & 1);
                    auVar118._4_4_ =
                         (uint)bVar12 * (int)auVar147._4_4_ | (uint)!bVar12 * auVar97._4_4_;
                    bVar12 = (bool)((byte)(uVar61 >> 2) & 1);
                    auVar118._8_4_ =
                         (uint)bVar12 * (int)auVar147._8_4_ | (uint)!bVar12 * auVar97._8_4_;
                    bVar12 = (bool)((byte)(uVar61 >> 3) & 1);
                    auVar118._12_4_ =
                         (uint)bVar12 * (int)auVar147._12_4_ | (uint)!bVar12 * auVar97._12_4_;
                    bVar12 = (bool)((byte)(uVar61 >> 4) & 1);
                    auVar118._16_4_ =
                         (uint)bVar12 * (int)auVar147._16_4_ | (uint)!bVar12 * auVar97._16_4_;
                    bVar12 = (bool)((byte)(uVar61 >> 5) & 1);
                    auVar118._20_4_ =
                         (uint)bVar12 * (int)auVar147._20_4_ | (uint)!bVar12 * auVar97._20_4_;
                    bVar12 = (bool)((byte)(uVar61 >> 6) & 1);
                    auVar118._24_4_ =
                         (uint)bVar12 * (int)auVar147._24_4_ | (uint)!bVar12 * auVar97._24_4_;
                    auVar118._28_4_ = (uint)!SUB81(uVar61 >> 7,0) * auVar97._28_4_;
                    auVar34._8_4_ = 0x40000000;
                    auVar34._0_8_ = 0x4000000040000000;
                    auVar34._12_4_ = 0x40000000;
                    auVar34._16_4_ = 0x40000000;
                    auVar34._20_4_ = 0x40000000;
                    auVar34._24_4_ = 0x40000000;
                    auVar34._28_4_ = 0x40000000;
                    local_620 = vfmsub132ps_avx512vl(auVar118,auVar94,auVar34);
                    local_5e0 = (undefined4)lVar68;
                    local_5d0 = local_870._0_8_;
                    uStack_5c8 = local_870._8_8_;
                    local_5c0 = local_880._0_8_;
                    uStack_5b8 = local_880._8_8_;
                    local_5b0 = local_890._0_8_;
                    uStack_5a8 = local_890._8_8_;
                    pGVar9 = (context->scene->geometries).items[uVar7].ptr;
                    if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) {
                      bVar60 = 0;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (bVar60 = 1, pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      auVar77 = vcvtsi2ss_avx512f(auVar196._0_16_,local_5e0);
                      fVar129 = auVar77._0_4_;
                      local_580[0] = (fVar129 + local_640._0_4_ + 0.0) * (float)local_440._0_4_;
                      local_580[1] = (fVar129 + local_640._4_4_ + 1.0) * (float)local_440._4_4_;
                      local_580[2] = (fVar129 + local_640._8_4_ + 2.0) * fStack_438;
                      local_580[3] = (fVar129 + local_640._12_4_ + 3.0) * fStack_434;
                      fStack_570 = (fVar129 + local_640._16_4_ + 4.0) * fStack_430;
                      fStack_56c = (fVar129 + local_640._20_4_ + 5.0) * fStack_42c;
                      fStack_568 = (fVar129 + local_640._24_4_ + 6.0) * fStack_428;
                      fStack_564 = fVar129 + local_640._28_4_ + 7.0;
                      local_560 = local_620;
                      local_540 = local_600;
                      lVar62 = 0;
                      uVar66 = (ulong)((byte)uVar142 & bVar70);
                      for (uVar61 = uVar66; (uVar61 & 1) == 0;
                          uVar61 = uVar61 >> 1 | 0x8000000000000000) {
                        lVar62 = lVar62 + 1;
                      }
                      local_740._0_4_ = (int)uVar64;
                      local_520 = auVar188;
                      local_5dc = iVar8;
                      do {
                        auVar197 = auVar198._0_16_;
                        local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_580[lVar62]));
                        local_480._0_8_ = lVar62;
                        local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_560 + lVar62 * 4)))
                        ;
                        *(undefined4 *)(ray + k * 4 + 0x200) =
                             *(undefined4 *)(local_540 + lVar62 * 4);
                        local_910.context = context->user;
                        fVar141 = local_200._0_4_;
                        fVar129 = 1.0 - fVar141;
                        auVar31._8_4_ = 0x80000000;
                        auVar31._0_8_ = 0x8000000080000000;
                        auVar31._12_4_ = 0x80000000;
                        auVar78 = vxorps_avx512vl(ZEXT416((uint)fVar129),auVar31);
                        auVar77 = ZEXT416((uint)(fVar141 * fVar129 * 4.0));
                        auVar76 = vfnmsub213ss_fma(local_200._0_16_,local_200._0_16_,auVar77);
                        auVar77 = vfmadd213ss_fma(ZEXT416((uint)fVar129),ZEXT416((uint)fVar129),
                                                  auVar77);
                        fVar129 = fVar129 * auVar78._0_4_ * 0.5;
                        fVar153 = auVar76._0_4_ * 0.5;
                        fVar140 = auVar77._0_4_ * 0.5;
                        fVar141 = fVar141 * fVar141 * 0.5;
                        auVar170._0_4_ = fVar141 * (float)local_710._0_4_;
                        auVar170._4_4_ = fVar141 * (float)local_710._4_4_;
                        auVar170._8_4_ = fVar141 * fStack_708;
                        auVar170._12_4_ = fVar141 * fStack_704;
                        auVar137._4_4_ = fVar140;
                        auVar137._0_4_ = fVar140;
                        auVar137._8_4_ = fVar140;
                        auVar137._12_4_ = fVar140;
                        auVar77 = vfmadd132ps_fma(auVar137,auVar170,local_890);
                        auVar161._4_4_ = fVar153;
                        auVar161._0_4_ = fVar153;
                        auVar161._8_4_ = fVar153;
                        auVar161._12_4_ = fVar153;
                        auVar77 = vfmadd132ps_fma(auVar161,auVar77,local_880);
                        auVar138._4_4_ = fVar129;
                        auVar138._0_4_ = fVar129;
                        auVar138._8_4_ = fVar129;
                        auVar138._12_4_ = fVar129;
                        auVar77 = vfmadd132ps_fma(auVar138,auVar77,local_870);
                        auVar139 = vbroadcastss_avx512f(auVar77);
                        auVar202 = vbroadcastss_avx512f(ZEXT416(1));
                        local_280 = vpermps_avx512f(auVar202,ZEXT1664(auVar77));
                        auVar202 = vbroadcastss_avx512f(ZEXT416(2));
                        local_240 = vpermps_avx512f(auVar202,ZEXT1664(auVar77));
                        local_2c0[0] = (RTCHitN)auVar139[0];
                        local_2c0[1] = (RTCHitN)auVar139[1];
                        local_2c0[2] = (RTCHitN)auVar139[2];
                        local_2c0[3] = (RTCHitN)auVar139[3];
                        local_2c0[4] = (RTCHitN)auVar139[4];
                        local_2c0[5] = (RTCHitN)auVar139[5];
                        local_2c0[6] = (RTCHitN)auVar139[6];
                        local_2c0[7] = (RTCHitN)auVar139[7];
                        local_2c0[8] = (RTCHitN)auVar139[8];
                        local_2c0[9] = (RTCHitN)auVar139[9];
                        local_2c0[10] = (RTCHitN)auVar139[10];
                        local_2c0[0xb] = (RTCHitN)auVar139[0xb];
                        local_2c0[0xc] = (RTCHitN)auVar139[0xc];
                        local_2c0[0xd] = (RTCHitN)auVar139[0xd];
                        local_2c0[0xe] = (RTCHitN)auVar139[0xe];
                        local_2c0[0xf] = (RTCHitN)auVar139[0xf];
                        local_2c0[0x10] = (RTCHitN)auVar139[0x10];
                        local_2c0[0x11] = (RTCHitN)auVar139[0x11];
                        local_2c0[0x12] = (RTCHitN)auVar139[0x12];
                        local_2c0[0x13] = (RTCHitN)auVar139[0x13];
                        local_2c0[0x14] = (RTCHitN)auVar139[0x14];
                        local_2c0[0x15] = (RTCHitN)auVar139[0x15];
                        local_2c0[0x16] = (RTCHitN)auVar139[0x16];
                        local_2c0[0x17] = (RTCHitN)auVar139[0x17];
                        local_2c0[0x18] = (RTCHitN)auVar139[0x18];
                        local_2c0[0x19] = (RTCHitN)auVar139[0x19];
                        local_2c0[0x1a] = (RTCHitN)auVar139[0x1a];
                        local_2c0[0x1b] = (RTCHitN)auVar139[0x1b];
                        local_2c0[0x1c] = (RTCHitN)auVar139[0x1c];
                        local_2c0[0x1d] = (RTCHitN)auVar139[0x1d];
                        local_2c0[0x1e] = (RTCHitN)auVar139[0x1e];
                        local_2c0[0x1f] = (RTCHitN)auVar139[0x1f];
                        local_2c0[0x20] = (RTCHitN)auVar139[0x20];
                        local_2c0[0x21] = (RTCHitN)auVar139[0x21];
                        local_2c0[0x22] = (RTCHitN)auVar139[0x22];
                        local_2c0[0x23] = (RTCHitN)auVar139[0x23];
                        local_2c0[0x24] = (RTCHitN)auVar139[0x24];
                        local_2c0[0x25] = (RTCHitN)auVar139[0x25];
                        local_2c0[0x26] = (RTCHitN)auVar139[0x26];
                        local_2c0[0x27] = (RTCHitN)auVar139[0x27];
                        local_2c0[0x28] = (RTCHitN)auVar139[0x28];
                        local_2c0[0x29] = (RTCHitN)auVar139[0x29];
                        local_2c0[0x2a] = (RTCHitN)auVar139[0x2a];
                        local_2c0[0x2b] = (RTCHitN)auVar139[0x2b];
                        local_2c0[0x2c] = (RTCHitN)auVar139[0x2c];
                        local_2c0[0x2d] = (RTCHitN)auVar139[0x2d];
                        local_2c0[0x2e] = (RTCHitN)auVar139[0x2e];
                        local_2c0[0x2f] = (RTCHitN)auVar139[0x2f];
                        local_2c0[0x30] = (RTCHitN)auVar139[0x30];
                        local_2c0[0x31] = (RTCHitN)auVar139[0x31];
                        local_2c0[0x32] = (RTCHitN)auVar139[0x32];
                        local_2c0[0x33] = (RTCHitN)auVar139[0x33];
                        local_2c0[0x34] = (RTCHitN)auVar139[0x34];
                        local_2c0[0x35] = (RTCHitN)auVar139[0x35];
                        local_2c0[0x36] = (RTCHitN)auVar139[0x36];
                        local_2c0[0x37] = (RTCHitN)auVar139[0x37];
                        local_2c0[0x38] = (RTCHitN)auVar139[0x38];
                        local_2c0[0x39] = (RTCHitN)auVar139[0x39];
                        local_2c0[0x3a] = (RTCHitN)auVar139[0x3a];
                        local_2c0[0x3b] = (RTCHitN)auVar139[0x3b];
                        local_2c0[0x3c] = (RTCHitN)auVar139[0x3c];
                        local_2c0[0x3d] = (RTCHitN)auVar139[0x3d];
                        local_2c0[0x3e] = (RTCHitN)auVar139[0x3e];
                        local_2c0[0x3f] = (RTCHitN)auVar139[0x3f];
                        local_180 = local_4c0._0_8_;
                        uStack_178 = local_4c0._8_8_;
                        uStack_170 = local_4c0._16_8_;
                        uStack_168 = local_4c0._24_8_;
                        uStack_160 = local_4c0._32_8_;
                        uStack_158 = local_4c0._40_8_;
                        uStack_150 = local_4c0._48_8_;
                        uStack_148 = local_4c0._56_8_;
                        auVar139 = vmovdqa64_avx512f(local_500);
                        local_140 = vmovdqa64_avx512f(auVar139);
                        vpcmpeqd_avx2(auVar139._0_32_,auVar139._0_32_);
                        local_100 = vbroadcastss_avx512f(ZEXT416((local_910.context)->instID[0]));
                        local_c0 = vbroadcastss_avx512f(ZEXT416((local_910.context)->instPrimID[0]))
                        ;
                        auVar139 = vmovdqa64_avx512f(local_300);
                        local_6c0 = vmovdqa64_avx512f(auVar139);
                        local_910.valid = (int *)local_6c0;
                        local_910.geometryUserPtr = pGVar9->userPtr;
                        local_910.hit = local_2c0;
                        local_910.N = 0x10;
                        local_910.ray = (RTCRayN *)ray;
                        if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar9->occlusionFilterN)(&local_910);
                          auVar192 = ZEXT3264(local_520);
                          uVar64 = (ulong)(uint)local_740._0_4_;
                          auVar194 = ZEXT3264(local_8e0);
                          auVar195 = ZEXT3264(local_8c0);
                          auVar200 = ZEXT3264(local_780);
                          auVar199 = ZEXT3264(local_760);
                          auVar77 = vxorps_avx512vl(auVar197,auVar197);
                          auVar198 = ZEXT1664(auVar77);
                          auVar139 = vmovdqa64_avx512f(local_6c0);
                        }
                        auVar77 = auVar198._0_16_;
                        uVar142 = vptestmd_avx512f(auVar139,auVar139);
                        if ((short)uVar142 == 0) {
                          auVar97 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar196 = ZEXT3264(auVar97);
                          auVar203 = ZEXT3264(local_800);
                          auVar201 = ZEXT3264(local_820);
                          auVar139 = ZEXT3264(local_840);
                          auVar202 = ZEXT3264(local_860);
                        }
                        else {
                          p_Var11 = context->args->filter;
                          if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var11)(&local_910);
                            auVar192 = ZEXT3264(local_520);
                            uVar64 = (ulong)(uint)local_740._0_4_;
                            auVar194 = ZEXT3264(local_8e0);
                            auVar195 = ZEXT3264(local_8c0);
                            auVar200 = ZEXT3264(local_780);
                            auVar199 = ZEXT3264(local_760);
                            auVar77 = vxorps_avx512vl(auVar77,auVar77);
                            auVar198 = ZEXT1664(auVar77);
                            auVar139 = vmovdqa64_avx512f(local_6c0);
                          }
                          uVar61 = vptestmd_avx512f(auVar139,auVar139);
                          auVar202 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                          bVar12 = (bool)((byte)uVar61 & 1);
                          auVar139._0_4_ =
                               (uint)bVar12 * auVar202._0_4_ |
                               (uint)!bVar12 * *(int *)(local_910.ray + 0x200);
                          bVar12 = (bool)((byte)(uVar61 >> 1) & 1);
                          auVar139._4_4_ =
                               (uint)bVar12 * auVar202._4_4_ |
                               (uint)!bVar12 * *(int *)(local_910.ray + 0x204);
                          bVar12 = (bool)((byte)(uVar61 >> 2) & 1);
                          auVar139._8_4_ =
                               (uint)bVar12 * auVar202._8_4_ |
                               (uint)!bVar12 * *(int *)(local_910.ray + 0x208);
                          bVar12 = (bool)((byte)(uVar61 >> 3) & 1);
                          auVar139._12_4_ =
                               (uint)bVar12 * auVar202._12_4_ |
                               (uint)!bVar12 * *(int *)(local_910.ray + 0x20c);
                          bVar12 = (bool)((byte)(uVar61 >> 4) & 1);
                          auVar139._16_4_ =
                               (uint)bVar12 * auVar202._16_4_ |
                               (uint)!bVar12 * *(int *)(local_910.ray + 0x210);
                          bVar12 = (bool)((byte)(uVar61 >> 5) & 1);
                          auVar139._20_4_ =
                               (uint)bVar12 * auVar202._20_4_ |
                               (uint)!bVar12 * *(int *)(local_910.ray + 0x214);
                          bVar12 = (bool)((byte)(uVar61 >> 6) & 1);
                          auVar139._24_4_ =
                               (uint)bVar12 * auVar202._24_4_ |
                               (uint)!bVar12 * *(int *)(local_910.ray + 0x218);
                          bVar12 = (bool)((byte)(uVar61 >> 7) & 1);
                          auVar139._28_4_ =
                               (uint)bVar12 * auVar202._28_4_ |
                               (uint)!bVar12 * *(int *)(local_910.ray + 0x21c);
                          bVar12 = (bool)((byte)(uVar61 >> 8) & 1);
                          auVar139._32_4_ =
                               (uint)bVar12 * auVar202._32_4_ |
                               (uint)!bVar12 * *(int *)(local_910.ray + 0x220);
                          bVar12 = (bool)((byte)(uVar61 >> 9) & 1);
                          auVar139._36_4_ =
                               (uint)bVar12 * auVar202._36_4_ |
                               (uint)!bVar12 * *(int *)(local_910.ray + 0x224);
                          bVar12 = (bool)((byte)(uVar61 >> 10) & 1);
                          auVar139._40_4_ =
                               (uint)bVar12 * auVar202._40_4_ |
                               (uint)!bVar12 * *(int *)(local_910.ray + 0x228);
                          bVar12 = (bool)((byte)(uVar61 >> 0xb) & 1);
                          auVar139._44_4_ =
                               (uint)bVar12 * auVar202._44_4_ |
                               (uint)!bVar12 * *(int *)(local_910.ray + 0x22c);
                          bVar12 = (bool)((byte)(uVar61 >> 0xc) & 1);
                          auVar139._48_4_ =
                               (uint)bVar12 * auVar202._48_4_ |
                               (uint)!bVar12 * *(int *)(local_910.ray + 0x230);
                          bVar12 = (bool)((byte)(uVar61 >> 0xd) & 1);
                          auVar139._52_4_ =
                               (uint)bVar12 * auVar202._52_4_ |
                               (uint)!bVar12 * *(int *)(local_910.ray + 0x234);
                          bVar12 = (bool)((byte)(uVar61 >> 0xe) & 1);
                          auVar139._56_4_ =
                               (uint)bVar12 * auVar202._56_4_ |
                               (uint)!bVar12 * *(int *)(local_910.ray + 0x238);
                          bVar12 = SUB81(uVar61 >> 0xf,0);
                          auVar139._60_4_ =
                               (uint)bVar12 * auVar202._60_4_ |
                               (uint)!bVar12 * *(int *)(local_910.ray + 0x23c);
                          *(undefined1 (*) [64])(local_910.ray + 0x200) = auVar139;
                          auVar97 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar196 = ZEXT3264(auVar97);
                          auVar203 = ZEXT3264(local_800);
                          auVar201 = ZEXT3264(local_820);
                          auVar139 = ZEXT3264(local_840);
                          auVar202 = ZEXT3264(local_860);
                          if ((short)uVar61 != 0) {
                            bVar60 = 1;
                            break;
                          }
                        }
                        *(int *)(ray + k * 4 + 0x200) = auVar192._0_4_;
                        bVar60 = 0;
                        lVar62 = 0;
                        uVar66 = uVar66 ^ 1L << (local_480._0_8_ & 0x3f);
                        for (uVar61 = uVar66; (uVar61 & 1) == 0;
                            uVar61 = uVar61 >> 1 | 0x8000000000000000) {
                          lVar62 = lVar62 + 1;
                        }
                      } while (uVar66 != 0);
                    }
                    uVar64 = CONCAT71((int7)(uVar64 >> 8),(byte)uVar64 | bVar60);
                  }
                }
                goto LAB_01bbf68f;
              }
            }
            auVar195 = ZEXT3264(local_8c0);
            auVar194 = ZEXT3264(local_8e0);
          }
LAB_01bbf68f:
          lVar68 = lVar68 + 8;
        } while ((int)lVar68 < iVar8);
      }
      bVar70 = (byte)uVar64;
      if ((uVar64 & 1) != 0) break;
      uVar130 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar30._4_4_ = uVar130;
      auVar30._0_4_ = uVar130;
      auVar30._8_4_ = uVar130;
      auVar30._12_4_ = uVar130;
      uVar142 = vcmpps_avx512vl(local_650,auVar30,2);
      uVar67 = (uint)uVar69 & (uint)uVar69 + 0xf & (uint)uVar142;
      uVar69 = (ulong)uVar67;
    } while (uVar67 != 0);
  }
  return (bool)(bVar70 & 1);
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }